

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct_x86_avx512::forward
          (InnerProduct_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined4 uVar6;
  float fVar7;
  int *piVar8;
  void *pvVar9;
  undefined4 *puVar10;
  uint *puVar11;
  void *pvVar12;
  float *pfVar13;
  bool bVar14;
  byte bVar15;
  ulong uVar16;
  ulong uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  byte bVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined4 uVar81;
  undefined4 uVar82;
  undefined4 uVar83;
  undefined4 uVar84;
  float afVar85 [16];
  float afVar86 [16];
  float afVar87 [16];
  float afVar88 [16];
  float afVar89 [16];
  float afVar90 [16];
  float afVar91 [16];
  float afVar92 [16];
  float afVar93 [16];
  float afVar94 [16];
  float afVar95 [16];
  float afVar96 [16];
  int p;
  int iVar97;
  uint uVar98;
  ulong uVar99;
  undefined1 (*pauVar100) [32];
  ulong uVar101;
  long lVar102;
  void *pvVar103;
  long lVar104;
  long lVar105;
  undefined1 (*pauVar106) [64];
  undefined1 (*pauVar107) [32];
  undefined1 (*pauVar108) [32];
  int iVar109;
  uint uVar110;
  long lVar111;
  long lVar112;
  uint uVar113;
  uint uVar114;
  long lVar115;
  long lVar116;
  long lVar117;
  uint uVar118;
  ushort uVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [28];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  float fVar197;
  float fVar198;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  v4sf one_4;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar213 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  float fVar220;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  v4sf one;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [32];
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 in_ZMM16 [64];
  undefined1 auVar264 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar265 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar266 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar267 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar268 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar269 [64];
  undefined1 in_ZMM30 [64];
  Option opt_flatten;
  uint local_158;
  undefined1 (*local_128) [32];
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  int local_110;
  Allocator *local_108;
  int local_100;
  int iStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  int iStack_f0;
  size_t local_e8;
  ulong local_e0;
  InnerProduct_x86_avx512 *local_d8;
  Mat *local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [48];
  
  auVar122 = in_ZMM30._0_16_;
  auVar120 = in_ZMM29._0_16_;
  if ((opt->use_int8_inference == true) && ((this->super_InnerProduct).int8_scale_term != 0)) {
    iVar97 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar97;
  }
  iVar97 = cpu_support_x86_f16c();
  if ((iVar97 != 0) && (opt->use_fp16_storage == true)) {
    iVar97 = forward_fp16s(this,bottom_blob,top_blob,opt);
    return iVar97;
  }
  local_100 = bottom_blob->dims;
  if ((local_100 == 2) &&
     (iVar97 = (this->super_InnerProduct).num_output,
     bottom_blob->w == (this->super_InnerProduct).weight_data_size / iVar97)) {
    Mat::create(top_blob,iVar97,bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,
                opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    innerproduct_gemm_sse
              (bottom_blob,top_blob,&this->weight_data_tm,&(this->super_InnerProduct).bias_data,
               (this->super_InnerProduct).activation_type,
               &(this->super_InnerProduct).activation_params,opt);
    return 0;
  }
  piVar8 = bottom_blob->refcount;
  local_128 = (undefined1 (*) [32])bottom_blob->data;
  uStack_120 = SUB84(bottom_blob->refcount,0);
  uStack_11c = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_118 = (undefined4)bottom_blob->elemsize;
  uStack_114 = (undefined4)(bottom_blob->elemsize >> 0x20);
  local_110 = bottom_blob->elempack;
  local_108 = bottom_blob->allocator;
  uVar81 = bottom_blob->w;
  uVar82 = bottom_blob->h;
  uVar83 = bottom_blob->d;
  uVar84 = bottom_blob->c;
  local_e8 = bottom_blob->cstep;
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + 1;
    UNLOCK();
  }
  iStack_fc = uVar81;
  uStack_f8 = uVar82;
  uStack_f4 = uVar83;
  iStack_f0 = uVar84;
  if (bottom_blob->dims != 1) {
    auStack_68 = SUB6448(*opt,0x10);
    local_78 = SUB648(*opt,0);
    pAStack_70 = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_128);
    if ((local_128 == (undefined1 (*) [32])0x0) || ((long)iStack_f0 * local_e8 == 0)) {
      iVar97 = -100;
      goto LAB_002cff3d;
    }
  }
  uVar98 = 1;
  if (opt->use_packing_layout == true) {
    uVar98 = (this->super_InnerProduct).num_output;
    if ((uVar98 & 0xf) == 0) {
      uVar98 = 0x10;
    }
    else if ((uVar98 & 7) == 0) {
      uVar98 = 8;
    }
    else {
      uVar98 = (uint)((uVar98 & 3) == 0) * 3 + 1;
    }
  }
  Mat::create(top_blob,(this->super_InnerProduct).num_output / (int)uVar98,
              (ulong)uVar98 * (CONCAT44(uStack_114,local_118) / (ulong)(long)local_110),uVar98,
              opt->blob_allocator);
  pauVar108 = local_128;
  afVar96 = _ps512_cephes_log_q2;
  afVar95 = _ps512_cephes_log_q1;
  afVar94 = ::_ps512_cephes_exp_p5;
  afVar93 = ::_ps512_cephes_exp_p4;
  afVar92 = ::_ps512_cephes_exp_p3;
  afVar91 = ::_ps512_cephes_exp_p2;
  afVar90 = ::_ps512_cephes_exp_p1;
  afVar89 = ::_ps512_cephes_exp_p0;
  afVar88 = ::_ps512_cephes_LOG2EF;
  afVar87 = ::_ps512_exp_lo;
  afVar86 = ::_ps512_exp_hi;
  afVar85 = ::_ps512_1;
  iVar97 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_002cff3d;
  uVar98 = (this->super_InnerProduct).activation_type;
  uVar118 = local_110 * iStack_fc;
  iVar97 = top_blob->elempack;
  uVar110 = top_blob->w;
  uVar99 = (ulong)uVar110;
  pvVar9 = (this->super_InnerProduct).bias_data.data;
  if (iVar97 < 8) {
LAB_002ce948:
    if (iVar97 == 1) {
      local_e0 = (ulong)(int)uVar110;
      lVar111 = (long)(int)uVar118;
      if (0 < (int)uVar110 >> 3) {
        local_90 = (ulong)(uint)((int)uVar110 >> 3);
        lVar102 = lVar111 * 0x1c;
        local_98 = lVar111 * 0x20;
        lVar116 = lVar111 * 8;
        lVar105 = lVar111 * 0x18;
        local_c0 = lVar111 * 0xc;
        local_c8 = 0;
        auVar147 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar148 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar226._8_4_ = 0x3f000000;
        auVar226._0_8_ = 0x3f0000003f000000;
        auVar226._12_4_ = 0x3f000000;
        auVar226._16_4_ = 0x3f000000;
        auVar226._20_4_ = 0x3f000000;
        auVar226._24_4_ = 0x3f000000;
        auVar226._28_4_ = 0x3f000000;
        auVar149 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar235._8_4_ = 0x3f800000;
        auVar235._0_8_ = 0x3f8000003f800000;
        auVar235._12_4_ = 0x3f800000;
        auVar235._16_4_ = 0x3f800000;
        auVar235._20_4_ = 0x3f800000;
        auVar235._24_4_ = 0x3f800000;
        auVar235._28_4_ = 0x3f800000;
        auVar238._8_4_ = 0x3f318000;
        auVar238._0_8_ = 0x3f3180003f318000;
        auVar238._12_4_ = 0x3f318000;
        auVar238._16_4_ = 0x3f318000;
        auVar238._20_4_ = 0x3f318000;
        auVar238._24_4_ = 0x3f318000;
        auVar238._28_4_ = 0x3f318000;
        auVar246._8_4_ = 0x39506967;
        auVar246._0_8_ = 0x3950696739506967;
        auVar246._12_4_ = 0x39506967;
        auVar246._16_4_ = 0x39506967;
        auVar246._20_4_ = 0x39506967;
        auVar246._24_4_ = 0x39506967;
        auVar246._28_4_ = 0x39506967;
        auVar150 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar151 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar152 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar255._8_4_ = 0x3e2aaaaa;
        auVar255._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar255._12_4_ = 0x3e2aaaaa;
        auVar255._16_4_ = 0x3e2aaaaa;
        auVar255._20_4_ = 0x3e2aaaaa;
        auVar255._24_4_ = 0x3e2aaaaa;
        auVar255._28_4_ = 0x3e2aaaaa;
        auVar259._8_4_ = 0x3f800000;
        auVar259._0_8_ = 0x3f8000003f800000;
        auVar259._12_4_ = 0x3f800000;
        auVar259._16_4_ = 0x3f800000;
        auVar259._20_4_ = 0x3f800000;
        auVar259._24_4_ = 0x3f800000;
        auVar259._28_4_ = 0x3f800000;
        auVar261._8_4_ = 0xb95e8083;
        auVar261._0_8_ = 0xb95e8083b95e8083;
        auVar261._12_4_ = 0xb95e8083;
        auVar261._16_4_ = 0xb95e8083;
        auVar261._20_4_ = 0xb95e8083;
        auVar261._24_4_ = 0xb95e8083;
        auVar261._28_4_ = 0xb95e8083;
        auVar166 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar167 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar168 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar169 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar170 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar171 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar120 = vxorps_avx512vl(auVar122,auVar122);
        auVar172 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        uVar99 = 0;
        lVar115 = lVar111 * 4;
        lVar112 = lVar111 * 0x14;
        lVar117 = lVar111 << 4;
        do {
          local_b8 = lVar117;
          local_b0 = lVar112;
          local_a8 = lVar115;
          local_80 = uVar99 * 8;
          auVar186 = ZEXT1664(ZEXT816(0) << 0x40);
          if (pvVar9 != (void *)0x0) {
            auVar186 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar9 + uVar99 * 0x20));
          }
          auVar178 = auVar186._0_32_;
          pvVar103 = (this->weight_data_tm).data;
          if ((int)uVar118 < 8) {
            uVar113 = 0;
            lVar115 = local_80 * lVar111 * 4;
            lVar112 = (local_80 | 1) * lVar111 * 4;
            lVar117 = (local_80 | 2) * lVar111 * 4;
            lVar1 = (local_80 | 3) * lVar111 * 4;
            lVar2 = (local_80 | 4) * lVar111 * 4;
            lVar3 = (local_80 | 5) * lVar111 * 4;
            lVar4 = (local_80 | 6) * lVar111 * 4;
            lVar5 = (local_80 | 7) * lVar111 * 4;
            auVar155 = SUB6432(ZEXT864(0),0);
            auVar154 = ZEXT832(0);
            auVar153 = ZEXT832(0);
            auVar177 = SUB6432(ZEXT864(0),0);
            auVar176 = ZEXT832(0);
            auVar175 = SUB6432(ZEXT864(0),0);
            auVar174 = ZEXT832(0);
            auVar173 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            pauVar107 = local_128;
            local_a0 = lVar102;
          }
          else {
            auVar264 = ZEXT1664((undefined1  [16])0x0);
            iVar97 = 7;
            auVar269 = ZEXT864(0);
            auVar192 = ZEXT864(0);
            auVar189 = ZEXT864(0);
            auVar191 = ZEXT864(0);
            auVar188 = ZEXT864(0);
            auVar187 = ZEXT864(0);
            auVar190 = ZEXT864(0);
            lVar115 = 0;
            do {
              lVar104 = lVar115;
              auVar155 = *(undefined1 (*) [32])(*local_128 + lVar104);
              auVar173 = vfmadd231ps_avx512vl
                                   (auVar264._0_32_,auVar155,
                                    *(undefined1 (*) [32])((long)pvVar103 + lVar104 + local_c8));
              auVar264 = ZEXT3264(auVar173);
              auVar174 = vfmadd231ps_avx512vl
                                   (auVar269._0_32_,auVar155,
                                    *(undefined1 (*) [32])((long)pvVar103 + lVar104 + local_a8));
              auVar269 = ZEXT3264(auVar174);
              auVar175 = vfmadd231ps_avx512vl
                                   (auVar192._0_32_,auVar155,
                                    *(undefined1 (*) [32])((long)pvVar103 + lVar104 + lVar116));
              auVar192 = ZEXT3264(auVar175);
              auVar176 = vfmadd231ps_avx512vl
                                   (auVar189._0_32_,auVar155,
                                    *(undefined1 (*) [32])((long)pvVar103 + lVar104 + local_c0));
              auVar189 = ZEXT3264(auVar176);
              auVar177 = vfmadd231ps_avx512vl
                                   (auVar191._0_32_,auVar155,
                                    *(undefined1 (*) [32])((long)pvVar103 + lVar104 + local_b8));
              auVar191 = ZEXT3264(auVar177);
              auVar153 = vfmadd231ps_avx512vl
                                   (auVar188._0_32_,auVar155,
                                    *(undefined1 (*) [32])((long)pvVar103 + lVar104 + local_b0));
              auVar188 = ZEXT3264(auVar153);
              auVar154 = vfmadd231ps_avx512vl
                                   (auVar187._0_32_,auVar155,
                                    *(undefined1 (*) [32])((long)pvVar103 + lVar104 + lVar105));
              auVar187 = ZEXT3264(auVar154);
              auVar155 = vfmadd231ps_avx512vl
                                   (auVar190._0_32_,auVar155,
                                    *(undefined1 (*) [32])((long)pvVar103 + lVar104 + lVar102));
              auVar190 = ZEXT3264(auVar155);
              iVar97 = iVar97 + 8;
              lVar115 = lVar104 + 0x20;
            } while (iVar97 < (int)uVar118);
            lVar5 = lVar115 + lVar102;
            lVar4 = lVar115 + lVar105;
            lVar3 = lVar115 + local_b0;
            lVar2 = lVar115 + local_b8;
            lVar1 = lVar115 + local_c0;
            lVar117 = lVar115 + lVar116;
            lVar112 = lVar115 + local_a8;
            lVar115 = lVar115 + local_c8;
            pauVar107 = (undefined1 (*) [32])(local_128[1] + lVar104);
            uVar113 = uVar118 & 0xfffffff8;
          }
          if (uVar118 - uVar113 != 0 && (int)uVar113 <= (int)uVar118) {
            lVar104 = 0;
            do {
              auVar122 = vinsertps_avx512f(ZEXT416(*(uint *)((long)pvVar103 + lVar104 * 4 + lVar2)),
                                           ZEXT416(*(uint *)((long)pvVar103 + lVar104 * 4 + lVar3)),
                                           0x10);
              auVar122 = vinsertps_avx512f(auVar122,ZEXT416(*(uint *)((long)pvVar103 +
                                                                     lVar104 * 4 + lVar4)),0x20);
              auVar122 = vinsertps_avx512f(auVar122,ZEXT416(*(uint *)((long)pvVar103 +
                                                                     lVar104 * 4 + lVar5)),0x30);
              auVar121 = vinsertps_avx512f(ZEXT416(*(uint *)((long)pvVar103 + lVar104 * 4 + lVar115)
                                                  ),ZEXT416(*(uint *)((long)pvVar103 +
                                                                     lVar104 * 4 + lVar112)),0x10);
              auVar121 = vinsertps_avx512f(auVar121,ZEXT416(*(uint *)((long)pvVar103 +
                                                                     lVar104 * 4 + lVar117)),0x20);
              auVar121 = vinsertps_avx512f(auVar121,ZEXT416(*(uint *)((long)pvVar103 +
                                                                     lVar104 * 4 + lVar1)),0x30);
              auVar178 = vinsertf32x4_avx512vl(ZEXT1632(auVar121),auVar122,1);
              uVar6 = *(undefined4 *)(*pauVar107 + lVar104 * 4);
              auVar51._4_4_ = uVar6;
              auVar51._0_4_ = uVar6;
              auVar51._8_4_ = uVar6;
              auVar51._12_4_ = uVar6;
              auVar51._16_4_ = uVar6;
              auVar51._20_4_ = uVar6;
              auVar51._24_4_ = uVar6;
              auVar51._28_4_ = uVar6;
              auVar178 = vfmadd231ps_avx512vl(auVar186._0_32_,auVar178,auVar51);
              auVar186 = ZEXT3264(auVar178);
              lVar104 = lVar104 + 1;
            } while (uVar118 - uVar113 != (int)lVar104);
          }
          auVar173 = vhaddps_avx(auVar173,auVar174);
          auVar174 = vhaddps_avx(auVar175,auVar176);
          auVar174 = vhaddps_avx(auVar173,auVar174);
          auVar173 = vhaddps_avx(auVar177,auVar153);
          auVar175 = vhaddps_avx(auVar154,auVar155);
          auVar175 = vhaddps_avx(auVar173,auVar175);
          auVar173 = vblendps_avx(auVar174,auVar175,0xf0);
          auVar174 = vperm2f128_avx(auVar174,auVar175,0x21);
          auVar184._0_4_ = auVar174._0_4_ + auVar173._0_4_ + auVar178._0_4_;
          auVar184._4_4_ = auVar174._4_4_ + auVar173._4_4_ + auVar178._4_4_;
          auVar184._8_4_ = auVar174._8_4_ + auVar173._8_4_ + auVar178._8_4_;
          auVar184._12_4_ = auVar174._12_4_ + auVar173._12_4_ + auVar178._12_4_;
          auVar184._16_4_ = auVar174._16_4_ + auVar173._16_4_ + auVar178._16_4_;
          auVar184._20_4_ = auVar174._20_4_ + auVar173._20_4_ + auVar178._20_4_;
          auVar184._24_4_ = auVar174._24_4_ + auVar173._24_4_ + auVar178._24_4_;
          auVar184._28_4_ = auVar174._28_4_ + auVar173._28_4_ + auVar178._28_4_;
          if (5 < uVar98 - 1) goto LAB_002cf610;
          auVar178 = ZEXT1632(auVar120);
          switch(uVar98) {
          case 1:
            auVar184 = vmaxps_avx512vl(auVar184,ZEXT1632(auVar120));
            break;
          case 2:
            auVar173 = vmaxps_avx512vl(auVar184,auVar178);
            auVar178 = vminps_avx512vl(auVar184,auVar178);
            uVar6 = *(this->super_InnerProduct).activation_params.data;
            auVar74._4_4_ = uVar6;
            auVar74._0_4_ = uVar6;
            auVar74._8_4_ = uVar6;
            auVar74._12_4_ = uVar6;
            auVar74._16_4_ = uVar6;
            auVar74._20_4_ = uVar6;
            auVar74._24_4_ = uVar6;
            auVar74._28_4_ = uVar6;
            auVar184 = vfmadd132ps_avx512vl(auVar178,auVar173,auVar74);
            break;
          case 3:
            puVar10 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar6 = *puVar10;
            auVar72._4_4_ = uVar6;
            auVar72._0_4_ = uVar6;
            auVar72._8_4_ = uVar6;
            auVar72._12_4_ = uVar6;
            auVar72._16_4_ = uVar6;
            auVar72._20_4_ = uVar6;
            auVar72._24_4_ = uVar6;
            auVar72._28_4_ = uVar6;
            auVar178 = vmaxps_avx512vl(auVar184,auVar72);
            uVar6 = puVar10[1];
            auVar73._4_4_ = uVar6;
            auVar73._0_4_ = uVar6;
            auVar73._8_4_ = uVar6;
            auVar73._12_4_ = uVar6;
            auVar73._16_4_ = uVar6;
            auVar73._20_4_ = uVar6;
            auVar73._24_4_ = uVar6;
            auVar73._28_4_ = uVar6;
            auVar184 = vminps_avx512vl(auVar178,auVar73);
            break;
          case 4:
            auVar70._8_4_ = 0x80000000;
            auVar70._0_8_ = 0x8000000080000000;
            auVar70._12_4_ = 0x80000000;
            auVar70._16_4_ = 0x80000000;
            auVar70._20_4_ = 0x80000000;
            auVar70._24_4_ = 0x80000000;
            auVar70._28_4_ = 0x80000000;
            auVar178 = vxorps_avx512vl(auVar184,auVar70);
            auVar178 = vminps_avx512vl(auVar178,auVar147);
            auVar173 = vmaxps_avx512vl(auVar178,auVar148);
            auVar174 = vfmadd231ps_avx512vl(auVar226,auVar173,auVar149);
            auVar178 = vroundps_avx(auVar174,1);
            uVar101 = vcmpps_avx512vl(auVar174,auVar178,1);
            auVar175 = vsubps_avx512vl(auVar178,auVar235);
            bVar14 = (bool)((byte)uVar101 & 1);
            auVar185._0_4_ = (float)((uint)bVar14 * auVar175._0_4_ | (uint)!bVar14 * auVar178._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar101 >> 1) & 1);
            auVar185._4_4_ = (float)((uint)bVar14 * auVar175._4_4_ | (uint)!bVar14 * auVar178._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar101 >> 2) & 1);
            auVar185._8_4_ = (float)((uint)bVar14 * auVar175._8_4_ | (uint)!bVar14 * auVar178._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar101 >> 3) & 1);
            auVar185._12_4_ =
                 (float)((uint)bVar14 * auVar175._12_4_ | (uint)!bVar14 * auVar178._12_4_);
            bVar14 = (bool)((byte)(uVar101 >> 4) & 1);
            auVar185._16_4_ =
                 (float)((uint)bVar14 * auVar175._16_4_ | (uint)!bVar14 * auVar178._16_4_);
            bVar14 = (bool)((byte)(uVar101 >> 5) & 1);
            auVar185._20_4_ =
                 (float)((uint)bVar14 * auVar175._20_4_ | (uint)!bVar14 * auVar178._20_4_);
            bVar14 = (bool)((byte)(uVar101 >> 6) & 1);
            auVar185._24_4_ =
                 (float)((uint)bVar14 * auVar175._24_4_ | (uint)!bVar14 * auVar178._24_4_);
            bVar14 = SUB81(uVar101 >> 7,0);
            auVar185._28_4_ =
                 (float)((uint)bVar14 * auVar175._28_4_ | (uint)!bVar14 * auVar178._28_4_);
            auVar122 = vfmsub231ps_fma(auVar173,auVar185,auVar238);
            auVar71._8_4_ = 0x395e8083;
            auVar71._0_8_ = 0x395e8083395e8083;
            auVar71._12_4_ = 0x395e8083;
            auVar71._16_4_ = 0x395e8083;
            auVar71._20_4_ = 0x395e8083;
            auVar71._24_4_ = 0x395e8083;
            auVar71._28_4_ = 0x395e8083;
            auVar178 = vfmsub231ps_avx512vl(ZEXT1632(auVar122),auVar185,auVar71);
            auVar77._4_4_ = auVar178._4_4_ * auVar178._4_4_;
            auVar77._0_4_ = auVar178._0_4_ * auVar178._0_4_;
            auVar77._8_4_ = auVar178._8_4_ * auVar178._8_4_;
            auVar77._12_4_ = auVar178._12_4_ * auVar178._12_4_;
            auVar77._16_4_ = auVar178._16_4_ * auVar178._16_4_;
            auVar77._20_4_ = auVar178._20_4_ * auVar178._20_4_;
            auVar77._24_4_ = auVar178._24_4_ * auVar178._24_4_;
            auVar77._28_4_ = auVar174._28_4_;
            auVar173 = vfmadd213ps_avx512vl(auVar246,auVar178,auVar150);
            auVar173 = vfmadd213ps_avx512vl(auVar173,auVar178,auVar151);
            auVar173 = vfmadd213ps_avx512vl(auVar173,auVar178,auVar152);
            auVar122 = vfmadd213ps_fma(auVar173,auVar178,auVar255);
            auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar178,auVar226);
            auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar77,auVar178);
            auVar202._0_4_ = auVar122._0_4_ + 1.0;
            auVar202._4_4_ = auVar122._4_4_ + 1.0;
            auVar202._8_4_ = auVar122._8_4_ + 1.0;
            auVar202._12_4_ = auVar122._12_4_ + 1.0;
            auVar202._16_4_ = 0x3f800000;
            auVar202._20_4_ = 0x3f800000;
            auVar202._24_4_ = 0x3f800000;
            auVar202._28_4_ = 0x3f800000;
            auVar211._0_4_ = (int)auVar185._0_4_;
            auVar211._4_4_ = (int)auVar185._4_4_;
            auVar211._8_4_ = (int)auVar185._8_4_;
            auVar211._12_4_ = (int)auVar185._12_4_;
            auVar211._16_4_ = (int)auVar185._16_4_;
            auVar211._20_4_ = (int)auVar185._20_4_;
            auVar211._24_4_ = (int)auVar185._24_4_;
            auVar211._28_4_ = (int)auVar185._28_4_;
            auVar178 = vpslld_avx2(auVar211,0x17);
            auVar178 = vpaddd_avx2(auVar259,auVar178);
            auVar122 = vfmadd213ps_fma(auVar178,auVar202,auVar235);
            auVar184 = vdivps_avx(auVar235,ZEXT1632(auVar122));
            break;
          case 5:
            auVar173 = vminps_avx512vl(auVar184,auVar147);
            auVar174 = vmaxps_avx512vl(auVar173,auVar148);
            auVar122 = vfmadd213ps_fma(auVar149,auVar174,auVar226);
            auVar173 = vroundps_avx(ZEXT1632(auVar122),1);
            uVar101 = vcmpps_avx512vl(ZEXT1632(auVar122),auVar173,1);
            auVar175 = vsubps_avx512vl(auVar173,auVar235);
            bVar14 = (bool)((byte)uVar101 & 1);
            auVar179._0_4_ = (float)((uint)bVar14 * auVar175._0_4_ | (uint)!bVar14 * auVar173._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar101 >> 1) & 1);
            auVar179._4_4_ = (float)((uint)bVar14 * auVar175._4_4_ | (uint)!bVar14 * auVar173._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar101 >> 2) & 1);
            auVar179._8_4_ = (float)((uint)bVar14 * auVar175._8_4_ | (uint)!bVar14 * auVar173._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar101 >> 3) & 1);
            auVar179._12_4_ =
                 (float)((uint)bVar14 * auVar175._12_4_ | (uint)!bVar14 * auVar173._12_4_);
            bVar14 = (bool)((byte)(uVar101 >> 4) & 1);
            auVar179._16_4_ =
                 (float)((uint)bVar14 * auVar175._16_4_ | (uint)!bVar14 * auVar173._16_4_);
            bVar14 = (bool)((byte)(uVar101 >> 5) & 1);
            auVar179._20_4_ =
                 (float)((uint)bVar14 * auVar175._20_4_ | (uint)!bVar14 * auVar173._20_4_);
            bVar14 = (bool)((byte)(uVar101 >> 6) & 1);
            auVar179._24_4_ =
                 (float)((uint)bVar14 * auVar175._24_4_ | (uint)!bVar14 * auVar173._24_4_);
            bVar14 = SUB81(uVar101 >> 7,0);
            auVar179._28_4_ =
                 (float)((uint)bVar14 * auVar175._28_4_ | (uint)!bVar14 * auVar173._28_4_);
            auVar122 = vfmsub231ps_fma(auVar174,auVar179,auVar238);
            auVar121 = vfnmsub231ps_fma(ZEXT1632(auVar122),auVar179,auVar261);
            auVar174 = ZEXT1632(auVar121);
            auVar173 = vfmadd213ps_avx512vl(auVar246,auVar174,auVar150);
            auVar173 = vfmadd213ps_avx512vl(auVar173,auVar174,auVar151);
            auVar173 = vfmadd213ps_avx512vl(auVar173,auVar174,auVar152);
            auVar174 = ZEXT1632(auVar121);
            auVar122 = vfmadd213ps_fma(auVar173,auVar174,auVar255);
            auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar174,auVar226);
            auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),
                                       ZEXT1632(CONCAT412(auVar121._12_4_ * auVar121._12_4_,
                                                          CONCAT48(auVar121._8_4_ * auVar121._8_4_,
                                                                   CONCAT44(auVar121._4_4_ *
                                                                            auVar121._4_4_,
                                                                            auVar121._0_4_ *
                                                                            auVar121._0_4_)))),
                                       auVar174);
            auVar209._0_4_ = auVar122._0_4_ + 1.0;
            auVar209._4_4_ = auVar122._4_4_ + 1.0;
            auVar209._8_4_ = auVar122._8_4_ + 1.0;
            auVar209._12_4_ = auVar122._12_4_ + 1.0;
            auVar209._16_4_ = 0x3f800000;
            auVar209._20_4_ = 0x3f800000;
            auVar209._24_4_ = 0x3f800000;
            auVar209._28_4_ = 0x3f800000;
            auVar218._0_4_ = (int)auVar179._0_4_;
            auVar218._4_4_ = (int)auVar179._4_4_;
            auVar218._8_4_ = (int)auVar179._8_4_;
            auVar218._12_4_ = (int)auVar179._12_4_;
            auVar218._16_4_ = (int)auVar179._16_4_;
            auVar218._20_4_ = (int)auVar179._20_4_;
            auVar218._24_4_ = (int)auVar179._24_4_;
            auVar218._28_4_ = (int)auVar179._28_4_;
            auVar173 = vpslld_avx2(auVar218,0x17);
            auVar173 = vpaddd_avx2(auVar259,auVar173);
            auVar122 = vfmadd213ps_fma(auVar173,auVar209,auVar235);
            uVar101 = vcmpps_avx512vl(ZEXT1632(auVar122),auVar178,2);
            auVar62._8_4_ = 0x800000;
            auVar62._0_8_ = 0x80000000800000;
            auVar62._12_4_ = 0x800000;
            auVar62._16_4_ = 0x800000;
            auVar62._20_4_ = 0x800000;
            auVar62._24_4_ = 0x800000;
            auVar62._28_4_ = 0x800000;
            auVar178 = vmaxps_avx512vl(ZEXT1632(auVar122),auVar62);
            auVar175 = vpsrld_avx2(auVar178,0x17);
            auVar231._8_4_ = 0x807fffff;
            auVar231._0_8_ = 0x807fffff807fffff;
            auVar231._12_4_ = 0x807fffff;
            auVar231._16_4_ = 0x807fffff;
            auVar231._20_4_ = 0x807fffff;
            auVar231._24_4_ = 0x807fffff;
            auVar231._28_4_ = 0x807fffff;
            auVar63._8_4_ = 0x3f000000;
            auVar63._0_8_ = 0x3f0000003f000000;
            auVar63._12_4_ = 0x3f000000;
            auVar63._16_4_ = 0x3f000000;
            auVar63._20_4_ = 0x3f000000;
            auVar63._24_4_ = 0x3f000000;
            auVar63._28_4_ = 0x3f000000;
            auVar178 = vpternlogd_avx512vl(auVar178,auVar231,auVar63,0xea);
            auVar64._8_4_ = 0x3f3504f3;
            auVar64._0_8_ = 0x3f3504f33f3504f3;
            auVar64._12_4_ = 0x3f3504f3;
            auVar64._16_4_ = 0x3f3504f3;
            auVar64._20_4_ = 0x3f3504f3;
            auVar64._24_4_ = 0x3f3504f3;
            auVar64._28_4_ = 0x3f3504f3;
            uVar16 = vcmpps_avx512vl(auVar178,auVar64,1);
            auVar173 = vaddps_avx512vl(auVar178,auVar166);
            auVar174 = vaddps_avx512vl(auVar173,auVar178);
            bVar14 = (bool)((byte)uVar16 & 1);
            auVar180._0_4_ = (float)((uint)bVar14 * auVar174._0_4_ | (uint)!bVar14 * auVar173._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
            auVar180._4_4_ = (float)((uint)bVar14 * auVar174._4_4_ | (uint)!bVar14 * auVar173._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
            auVar180._8_4_ = (float)((uint)bVar14 * auVar174._8_4_ | (uint)!bVar14 * auVar173._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
            auVar180._12_4_ =
                 (float)((uint)bVar14 * auVar174._12_4_ | (uint)!bVar14 * auVar173._12_4_);
            bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
            auVar180._16_4_ =
                 (float)((uint)bVar14 * auVar174._16_4_ | (uint)!bVar14 * auVar173._16_4_);
            bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
            auVar180._20_4_ =
                 (float)((uint)bVar14 * auVar174._20_4_ | (uint)!bVar14 * auVar173._20_4_);
            bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
            auVar180._24_4_ =
                 (float)((uint)bVar14 * auVar174._24_4_ | (uint)!bVar14 * auVar173._24_4_);
            bVar14 = SUB81(uVar16 >> 7,0);
            auVar180._28_4_ = (uint)bVar14 * auVar174._28_4_ | (uint)!bVar14 * auVar173._28_4_;
            auVar75._4_4_ = auVar180._4_4_ * auVar180._4_4_;
            auVar75._0_4_ = auVar180._0_4_ * auVar180._0_4_;
            auVar75._8_4_ = auVar180._8_4_ * auVar180._8_4_;
            auVar75._12_4_ = auVar180._12_4_ * auVar180._12_4_;
            auVar75._16_4_ = auVar180._16_4_ * auVar180._16_4_;
            auVar75._20_4_ = auVar180._20_4_ * auVar180._20_4_;
            auVar75._24_4_ = auVar180._24_4_ * auVar180._24_4_;
            auVar75._28_4_ = auVar178._28_4_;
            auVar65._8_4_ = 0xbdebd1b8;
            auVar65._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar65._12_4_ = 0xbdebd1b8;
            auVar65._16_4_ = 0xbdebd1b8;
            auVar65._20_4_ = 0xbdebd1b8;
            auVar65._24_4_ = 0xbdebd1b8;
            auVar65._28_4_ = 0xbdebd1b8;
            auVar178 = vfmadd213ps_avx512vl(auVar167,auVar180,auVar65);
            auVar66._8_4_ = 0x3def251a;
            auVar66._0_8_ = 0x3def251a3def251a;
            auVar66._12_4_ = 0x3def251a;
            auVar66._16_4_ = 0x3def251a;
            auVar66._20_4_ = 0x3def251a;
            auVar66._24_4_ = 0x3def251a;
            auVar66._28_4_ = 0x3def251a;
            auVar178 = vfmadd213ps_avx512vl(auVar178,auVar180,auVar66);
            auVar67._8_4_ = 0xbdfe5d4f;
            auVar67._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar67._12_4_ = 0xbdfe5d4f;
            auVar67._16_4_ = 0xbdfe5d4f;
            auVar67._20_4_ = 0xbdfe5d4f;
            auVar67._24_4_ = 0xbdfe5d4f;
            auVar67._28_4_ = 0xbdfe5d4f;
            auVar178 = vfmadd213ps_avx512vl(auVar178,auVar180,auVar67);
            auVar68._8_4_ = 0x3e11e9bf;
            auVar68._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar68._12_4_ = 0x3e11e9bf;
            auVar68._16_4_ = 0x3e11e9bf;
            auVar68._20_4_ = 0x3e11e9bf;
            auVar68._24_4_ = 0x3e11e9bf;
            auVar68._28_4_ = 0x3e11e9bf;
            auVar178 = vfmadd213ps_avx512vl(auVar178,auVar180,auVar68);
            auVar178 = vfmadd213ps_avx512vl(auVar178,auVar180,auVar168);
            auVar178 = vfmadd213ps_avx512vl(auVar178,auVar180,auVar169);
            auVar178 = vfmadd213ps_avx512vl(auVar178,auVar180,auVar170);
            auVar178 = vfmadd213ps_avx512vl(auVar178,auVar180,auVar171);
            auVar76._4_4_ = auVar180._4_4_ * auVar180._4_4_ * auVar180._4_4_ * auVar178._4_4_;
            auVar76._0_4_ = auVar180._0_4_ * auVar180._0_4_ * auVar180._0_4_ * auVar178._0_4_;
            auVar76._8_4_ = auVar180._8_4_ * auVar180._8_4_ * auVar180._8_4_ * auVar178._8_4_;
            auVar76._12_4_ = auVar180._12_4_ * auVar180._12_4_ * auVar180._12_4_ * auVar178._12_4_;
            auVar76._16_4_ = auVar180._16_4_ * auVar180._16_4_ * auVar180._16_4_ * auVar178._16_4_;
            auVar76._20_4_ = auVar180._20_4_ * auVar180._20_4_ * auVar180._20_4_ * auVar178._20_4_;
            auVar76._24_4_ = auVar180._24_4_ * auVar180._24_4_ * auVar180._24_4_ * auVar178._24_4_;
            auVar76._28_4_ = auVar178._28_4_;
            auVar69._8_4_ = 0xffffff82;
            auVar69._0_8_ = 0xffffff82ffffff82;
            auVar69._12_4_ = 0xffffff82;
            auVar69._16_4_ = 0xffffff82;
            auVar69._20_4_ = 0xffffff82;
            auVar69._24_4_ = 0xffffff82;
            auVar69._28_4_ = 0xffffff82;
            auVar178 = vpaddd_avx512vl(auVar175,auVar69);
            auVar178 = vcvtdq2ps_avx(auVar178);
            auVar173 = vsubps_avx512vl(auVar178,auVar235);
            bVar14 = (bool)((byte)uVar16 & 1);
            auVar181._0_4_ = (uint)bVar14 * auVar173._0_4_ | (uint)!bVar14 * auVar178._0_4_;
            bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
            auVar181._4_4_ = (uint)bVar14 * auVar173._4_4_ | (uint)!bVar14 * auVar178._4_4_;
            bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
            auVar181._8_4_ = (uint)bVar14 * auVar173._8_4_ | (uint)!bVar14 * auVar178._8_4_;
            bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
            auVar181._12_4_ = (uint)bVar14 * auVar173._12_4_ | (uint)!bVar14 * auVar178._12_4_;
            bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
            auVar181._16_4_ = (uint)bVar14 * auVar173._16_4_ | (uint)!bVar14 * auVar178._16_4_;
            bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
            auVar181._20_4_ = (uint)bVar14 * auVar173._20_4_ | (uint)!bVar14 * auVar178._20_4_;
            bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
            auVar181._24_4_ = (uint)bVar14 * auVar173._24_4_ | (uint)!bVar14 * auVar178._24_4_;
            bVar14 = SUB81(uVar16 >> 7,0);
            auVar181._28_4_ = (uint)bVar14 * auVar173._28_4_ | (uint)!bVar14 * auVar178._28_4_;
            auVar122 = vfmadd231ps_fma(auVar76,auVar181,auVar261);
            auVar122 = vfmsub231ps_fma(ZEXT1632(auVar122),auVar226,auVar75);
            auVar178 = vsubps_avx(ZEXT1632(auVar122),auVar180);
            auVar122 = vfmsub231ps_fma(auVar178,auVar238,auVar181);
            auVar178 = vmulps_avx512vl(ZEXT1632(auVar122),auVar172);
            auVar173 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar14 = (bool)((byte)uVar101 & 1);
            auVar182._0_4_ = (uint)bVar14 * auVar173._0_4_ | (uint)!bVar14 * auVar178._0_4_;
            bVar14 = (bool)((byte)(uVar101 >> 1) & 1);
            auVar182._4_4_ = (uint)bVar14 * auVar173._4_4_ | (uint)!bVar14 * auVar178._4_4_;
            bVar14 = (bool)((byte)(uVar101 >> 2) & 1);
            auVar182._8_4_ = (uint)bVar14 * auVar173._8_4_ | (uint)!bVar14 * auVar178._8_4_;
            bVar14 = (bool)((byte)(uVar101 >> 3) & 1);
            auVar182._12_4_ = (uint)bVar14 * auVar173._12_4_ | (uint)!bVar14 * auVar178._12_4_;
            bVar14 = (bool)((byte)(uVar101 >> 4) & 1);
            auVar182._16_4_ = (uint)bVar14 * auVar173._16_4_ | (uint)!bVar14 * auVar178._16_4_;
            bVar14 = (bool)((byte)(uVar101 >> 5) & 1);
            auVar182._20_4_ = (uint)bVar14 * auVar173._20_4_ | (uint)!bVar14 * auVar178._20_4_;
            bVar14 = (bool)((byte)(uVar101 >> 6) & 1);
            auVar182._24_4_ = (uint)bVar14 * auVar173._24_4_ | (uint)!bVar14 * auVar178._24_4_;
            bVar14 = SUB81(uVar101 >> 7,0);
            auVar182._28_4_ = (uint)bVar14 * auVar173._28_4_ | (uint)!bVar14 * auVar178._28_4_;
            auVar178 = vminps_avx512vl(auVar182,auVar147);
            auVar173 = vmaxps_avx512vl(auVar178,auVar148);
            auVar122 = vfmadd213ps_fma(auVar149,auVar173,auVar226);
            auVar178 = vroundps_avx(ZEXT1632(auVar122),1);
            uVar101 = vcmpps_avx512vl(ZEXT1632(auVar122),auVar178,1);
            auVar174 = vsubps_avx512vl(auVar178,auVar235);
            bVar14 = (bool)((byte)uVar101 & 1);
            auVar183._0_4_ = (float)((uint)bVar14 * auVar174._0_4_ | (uint)!bVar14 * auVar178._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar101 >> 1) & 1);
            auVar183._4_4_ = (float)((uint)bVar14 * auVar174._4_4_ | (uint)!bVar14 * auVar178._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar101 >> 2) & 1);
            auVar183._8_4_ = (float)((uint)bVar14 * auVar174._8_4_ | (uint)!bVar14 * auVar178._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar101 >> 3) & 1);
            auVar183._12_4_ =
                 (float)((uint)bVar14 * auVar174._12_4_ | (uint)!bVar14 * auVar178._12_4_);
            bVar14 = (bool)((byte)(uVar101 >> 4) & 1);
            auVar183._16_4_ =
                 (float)((uint)bVar14 * auVar174._16_4_ | (uint)!bVar14 * auVar178._16_4_);
            bVar14 = (bool)((byte)(uVar101 >> 5) & 1);
            auVar183._20_4_ =
                 (float)((uint)bVar14 * auVar174._20_4_ | (uint)!bVar14 * auVar178._20_4_);
            bVar14 = (bool)((byte)(uVar101 >> 6) & 1);
            auVar183._24_4_ =
                 (float)((uint)bVar14 * auVar174._24_4_ | (uint)!bVar14 * auVar178._24_4_);
            bVar14 = SUB81(uVar101 >> 7,0);
            auVar183._28_4_ =
                 (float)((uint)bVar14 * auVar174._28_4_ | (uint)!bVar14 * auVar178._28_4_);
            auVar122 = vfmsub231ps_fma(auVar173,auVar183,auVar238);
            auVar121 = vfnmsub231ps_fma(ZEXT1632(auVar122),auVar183,auVar261);
            auVar173 = ZEXT1632(auVar121);
            auVar178 = vfmadd213ps_avx512vl(auVar246,auVar173,auVar150);
            auVar178 = vfmadd213ps_avx512vl(auVar178,auVar173,auVar151);
            auVar178 = vfmadd213ps_avx512vl(auVar178,auVar173,auVar152);
            auVar173 = ZEXT1632(auVar121);
            auVar122 = vfmadd213ps_fma(auVar178,auVar173,auVar255);
            auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar173,auVar226);
            auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),
                                       ZEXT1632(CONCAT412(auVar121._12_4_ * auVar121._12_4_,
                                                          CONCAT48(auVar121._8_4_ * auVar121._8_4_,
                                                                   CONCAT44(auVar121._4_4_ *
                                                                            auVar121._4_4_,
                                                                            auVar121._0_4_ *
                                                                            auVar121._0_4_)))),
                                       auVar173);
            auVar210._0_4_ = auVar122._0_4_ + 1.0;
            auVar210._4_4_ = auVar122._4_4_ + 1.0;
            auVar210._8_4_ = auVar122._8_4_ + 1.0;
            auVar210._12_4_ = auVar122._12_4_ + 1.0;
            auVar210._16_4_ = 0x3f800000;
            auVar210._20_4_ = 0x3f800000;
            auVar210._24_4_ = 0x3f800000;
            auVar210._28_4_ = 0x3f800000;
            auVar219._0_4_ = (int)auVar183._0_4_;
            auVar219._4_4_ = (int)auVar183._4_4_;
            auVar219._8_4_ = (int)auVar183._8_4_;
            auVar219._12_4_ = (int)auVar183._12_4_;
            auVar219._16_4_ = (int)auVar183._16_4_;
            auVar219._20_4_ = (int)auVar183._20_4_;
            auVar219._24_4_ = (int)auVar183._24_4_;
            auVar219._28_4_ = (int)auVar183._28_4_;
            auVar178 = vpslld_avx2(auVar219,0x17);
            auVar178 = vpaddd_avx2(auVar259,auVar178);
            auVar122 = vfmadd213ps_fma(auVar178,auVar210,auVar235);
            auVar178 = vdivps_avx(auVar235,ZEXT1632(auVar122));
            auVar178 = vfnmadd213ps_avx512vl(auVar178,auVar172,auVar166);
            auVar146 = auVar178._0_28_;
            goto LAB_002cf5db;
          case 6:
            puVar10 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar6 = *puVar10;
            auVar212._4_4_ = uVar6;
            auVar212._0_4_ = uVar6;
            auVar212._8_4_ = uVar6;
            auVar212._12_4_ = uVar6;
            auVar212._16_4_ = uVar6;
            auVar212._20_4_ = uVar6;
            auVar212._24_4_ = uVar6;
            auVar212._28_4_ = uVar6;
            uVar6 = puVar10[1];
            auVar61._4_4_ = uVar6;
            auVar61._0_4_ = uVar6;
            auVar61._8_4_ = uVar6;
            auVar61._12_4_ = uVar6;
            auVar61._16_4_ = uVar6;
            auVar61._20_4_ = uVar6;
            auVar61._24_4_ = uVar6;
            auVar61._28_4_ = uVar6;
            auVar173 = vfmadd213ps_avx512vl(auVar212,auVar184,auVar61);
            auVar178 = vmaxps_avx512vl(auVar173,auVar178);
            auVar178 = vminps_avx(auVar178,auVar235);
            auVar146 = auVar178._0_28_;
LAB_002cf5db:
            auVar184._4_4_ = auVar146._4_4_ * auVar184._4_4_;
            auVar184._0_4_ = auVar146._0_4_ * auVar184._0_4_;
            auVar184._8_4_ = auVar146._8_4_ * auVar184._8_4_;
            auVar184._12_4_ = auVar146._12_4_ * auVar184._12_4_;
            auVar184._16_4_ = auVar146._16_4_ * auVar184._16_4_;
            auVar184._20_4_ = auVar146._20_4_ * auVar184._20_4_;
            auVar184._24_4_ = auVar146._24_4_ * auVar184._24_4_;
          }
LAB_002cf610:
          *(undefined1 (*) [32])((long)top_blob->data + uVar99 * 0x20) = auVar184;
          uVar99 = uVar99 + 1;
          lVar102 = lVar102 + local_98;
          lVar105 = lVar105 + local_98;
          local_c0 = local_c0 + local_98;
          lVar116 = lVar116 + local_98;
          local_c8 = local_c8 + local_98;
          lVar115 = local_a8 + local_98;
          lVar112 = local_b0 + local_98;
          lVar117 = local_b8 + local_98;
          local_d8 = this;
          local_d0 = top_blob;
          local_88 = (ulong)uVar98;
        } while (uVar99 != local_90);
      }
      uVar99 = local_e0 & 0xfffffffffffffff8;
      if ((uVar110 >> 2 & 1) != 0) {
        if (pvVar9 == (void *)0x0) {
          auVar120 = ZEXT816(0) << 0x40;
        }
        else {
          auVar120 = *(undefined1 (*) [16])((long)pvVar9 + uVar99 * 4);
        }
        pvVar12 = (this->weight_data_tm).data;
        pvVar103 = (void *)((long)pvVar12 + uVar99 * lVar111 * 4);
        if ((int)uVar118 < 8) {
          uVar113 = 0;
          lVar116 = (uVar99 | 1) * lVar111 * 4;
          lVar105 = (uVar99 | 2) * lVar111 * 4;
          lVar102 = (uVar99 | 3) * lVar111 * 4;
          auVar122 = ZEXT816(0);
          auVar121 = ZEXT816(0);
          auVar123 = ZEXT816(0);
          auVar124 = ZEXT816(0);
          pauVar107 = local_128;
        }
        else {
          uVar113 = uVar118 & 0xfffffff8;
          lVar116 = (uVar99 + 3) * lVar111;
          lVar105 = (uVar99 + 2) * lVar111;
          lVar112 = (uVar99 + 1) * lVar111;
          auVar124 = ZEXT816(0);
          iVar97 = 7;
          auVar123 = ZEXT816(0);
          auVar121 = ZEXT816(0);
          auVar122 = ZEXT816(0);
          lVar115 = 0;
          do {
            lVar117 = lVar115;
            auVar147 = *(undefined1 (*) [32])(*local_128 + lVar117);
            auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar147,
                                       *(undefined1 (*) [32])((long)pvVar103 + lVar117));
            auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar147,
                                       *(undefined1 (*) [32])((long)pvVar12 + lVar117 + lVar112 * 4)
                                      );
            auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar147,
                                       *(undefined1 (*) [32])((long)pvVar12 + lVar117 + lVar105 * 4)
                                      );
            auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar147,
                                       *(undefined1 (*) [32])((long)pvVar12 + lVar117 + lVar116 * 4)
                                      );
            iVar97 = iVar97 + 8;
            lVar115 = lVar117 + 0x20;
          } while (iVar97 < (int)uVar118);
          lVar102 = lVar115 + lVar116 * 4;
          lVar105 = lVar115 + lVar105 * 4;
          lVar116 = lVar115 + lVar112 * 4;
          pvVar103 = (void *)((long)pvVar103 + lVar115);
          pauVar107 = (undefined1 (*) [32])(local_128[1] + lVar117);
        }
        lVar116 = (long)pvVar12 + lVar116;
        lVar105 = (long)pvVar12 + lVar105;
        lVar102 = (long)pvVar12 + lVar102;
        auVar125 = ZEXT816(0) << 0x40;
        if ((int)(uVar113 | 3) < (int)uVar118) {
          auVar199 = ZEXT816(0);
          lVar115 = 0;
          auVar127 = ZEXT816(0);
          auVar186 = ZEXT864(0);
          uVar114 = uVar113;
          do {
            auVar132 = *(undefined1 (*) [16])(*pauVar107 + lVar115);
            auVar125 = vfmadd231ps_fma(auVar125,auVar132,
                                       *(undefined1 (*) [16])((long)pvVar103 + lVar115));
            auVar126 = vfmadd231ps_fma(auVar186._0_16_,auVar132,
                                       *(undefined1 (*) [16])(lVar116 + lVar115));
            auVar186 = ZEXT1664(auVar126);
            auVar127 = vfmadd231ps_fma(auVar127,auVar132,*(undefined1 (*) [16])(lVar105 + lVar115));
            auVar199 = vfmadd231ps_fma(auVar199,auVar132,*(undefined1 (*) [16])(lVar102 + lVar115));
            uVar113 = uVar114 + 4;
            iVar97 = uVar114 + 7;
            lVar115 = lVar115 + 0x10;
            uVar114 = uVar113;
          } while (iVar97 < (int)uVar118);
          pauVar107 = (undefined1 (*) [32])(*pauVar107 + lVar115);
          lVar102 = lVar102 + lVar115;
          lVar105 = lVar105 + lVar115;
          lVar116 = lVar116 + lVar115;
          pvVar103 = (void *)((long)pvVar103 + lVar115);
        }
        else {
          auVar126 = SUB6416(ZEXT864(0),0);
          auVar127 = ZEXT816(0);
          auVar199 = ZEXT816(0);
        }
        if (uVar118 - uVar113 != 0 && (int)uVar113 <= (int)uVar118) {
          lVar115 = 0;
          do {
            auVar132 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar103 + lVar115 * 4)),
                                     ZEXT416(*(uint *)(lVar116 + lVar115 * 4)),0x10);
            auVar132 = vinsertps_avx(auVar132,ZEXT416(*(uint *)(lVar105 + lVar115 * 4)),0x20);
            auVar132 = vinsertps_avx(auVar132,ZEXT416(*(uint *)(lVar102 + lVar115 * 4)),0x30);
            uVar6 = *(undefined4 *)(*pauVar107 + lVar115 * 4);
            auVar129._4_4_ = uVar6;
            auVar129._0_4_ = uVar6;
            auVar129._8_4_ = uVar6;
            auVar129._12_4_ = uVar6;
            auVar120 = vfmadd231ps_avx512vl(auVar120,auVar132,auVar129);
            lVar115 = lVar115 + 1;
          } while (uVar118 - uVar113 != (int)lVar115);
        }
        auVar147 = vhaddps_avx(ZEXT1632(auVar122),ZEXT1632(auVar121));
        auVar148 = vhaddps_avx(ZEXT1632(auVar123),ZEXT1632(auVar124));
        auVar147 = vhaddps_avx(auVar147,auVar148);
        auVar123 = vunpcklps_avx(auVar125,auVar126);
        auVar124 = vunpcklps_avx(auVar127,auVar199);
        auVar122 = vunpckhps_avx(auVar125,auVar126);
        auVar125 = vunpckhps_avx(auVar127,auVar199);
        auVar121 = vmovlhps_avx(auVar123,auVar124);
        auVar124 = vunpckhpd_avx(auVar123,auVar124);
        auVar123 = vmovlhps_avx(auVar122,auVar125);
        auVar125 = vunpckhpd_avx(auVar122,auVar125);
        auVar122._0_4_ =
             auVar124._0_4_ + auVar121._0_4_ + auVar123._0_4_ + auVar125._0_4_ + auVar147._0_4_ +
             auVar120._0_4_ + auVar147._16_4_;
        auVar122._4_4_ =
             auVar124._4_4_ + auVar121._4_4_ + auVar123._4_4_ + auVar125._4_4_ + auVar147._4_4_ +
             auVar120._4_4_ + auVar147._20_4_;
        auVar122._8_4_ =
             auVar124._8_4_ + auVar121._8_4_ + auVar123._8_4_ + auVar125._8_4_ + auVar147._8_4_ +
             auVar120._8_4_ + auVar147._24_4_;
        auVar122._12_4_ =
             auVar124._12_4_ + auVar121._12_4_ + auVar123._12_4_ + auVar125._12_4_ + auVar147._12_4_
             + auVar120._12_4_ + auVar147._28_4_;
        switch(uVar98) {
        case 1:
          auVar79._12_4_ = 0;
          auVar79._0_12_ = ZEXT412(0);
          auVar122 = vmaxps_avx(auVar122,auVar79 << 0x20);
          break;
        case 2:
          auVar80._12_4_ = 0;
          auVar80._0_12_ = ZEXT412(0);
          auVar120 = vmaxps_avx(auVar122,auVar80 << 0x20);
          auVar122 = vminps_avx(auVar122,auVar80 << 0x20);
          uVar6 = *(this->super_InnerProduct).activation_params.data;
          auVar48._4_4_ = uVar6;
          auVar48._0_4_ = uVar6;
          auVar48._8_4_ = uVar6;
          auVar48._12_4_ = uVar6;
          auVar122 = vfmadd132ps_avx512vl(auVar122,auVar120,auVar48);
          break;
        case 3:
          puVar10 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar6 = *puVar10;
          auVar46._4_4_ = uVar6;
          auVar46._0_4_ = uVar6;
          auVar46._8_4_ = uVar6;
          auVar46._12_4_ = uVar6;
          auVar120 = vmaxps_avx512vl(auVar122,auVar46);
          uVar6 = puVar10[1];
          auVar47._4_4_ = uVar6;
          auVar47._0_4_ = uVar6;
          auVar47._8_4_ = uVar6;
          auVar47._12_4_ = uVar6;
          auVar122 = vminps_avx512vl(auVar120,auVar47);
          break;
        case 4:
          auVar36._8_4_ = 0x80000000;
          auVar36._0_8_ = 0x8000000080000000;
          auVar36._12_4_ = 0x80000000;
          auVar120 = vxorps_avx512vl(auVar122,auVar36);
          auVar37._8_4_ = 0x42b0c0a5;
          auVar37._0_8_ = 0x42b0c0a542b0c0a5;
          auVar37._12_4_ = 0x42b0c0a5;
          auVar120 = vminps_avx512vl(auVar120,auVar37);
          auVar38._8_4_ = 0xc2b0c0a5;
          auVar38._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar38._12_4_ = 0xc2b0c0a5;
          auVar121 = vmaxps_avx512vl(auVar120,auVar38);
          auVar205._8_4_ = 0x3f000000;
          auVar205._0_8_ = 0x3f0000003f000000;
          auVar205._12_4_ = 0x3f000000;
          auVar216._8_4_ = 0x3fb8aa3b;
          auVar216._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar216._12_4_ = 0x3fb8aa3b;
          auVar122 = vfmadd213ps_fma(auVar216,auVar121,auVar205);
          auVar225._0_4_ = (int)auVar122._0_4_;
          auVar225._4_4_ = (int)auVar122._4_4_;
          auVar225._8_4_ = (int)auVar122._8_4_;
          auVar225._12_4_ = (int)auVar122._12_4_;
          auVar120 = vcvtdq2ps_avx(auVar225);
          uVar101 = vcmpps_avx512vl(auVar122,auVar120,1);
          auVar217._8_4_ = 0x3f800000;
          auVar217._0_8_ = 0x3f8000003f800000;
          auVar217._12_4_ = 0x3f800000;
          auVar122 = vsubps_avx512vl(auVar120,auVar217);
          bVar14 = (bool)((byte)uVar101 & 1);
          auVar145._0_4_ = (float)((uint)bVar14 * auVar122._0_4_ | (uint)!bVar14 * auVar120._0_4_);
          bVar14 = (bool)((byte)(uVar101 >> 1) & 1);
          auVar145._4_4_ = (float)((uint)bVar14 * auVar122._4_4_ | (uint)!bVar14 * auVar120._4_4_);
          bVar14 = (bool)((byte)(uVar101 >> 2) & 1);
          auVar145._8_4_ = (float)((uint)bVar14 * auVar122._8_4_ | (uint)!bVar14 * auVar120._8_4_);
          bVar14 = (bool)((byte)(uVar101 >> 3) & 1);
          auVar145._12_4_ =
               (float)((uint)bVar14 * auVar122._12_4_ | (uint)!bVar14 * auVar120._12_4_);
          auVar39._8_4_ = 0x3f318000;
          auVar39._0_8_ = 0x3f3180003f318000;
          auVar39._12_4_ = 0x3f318000;
          auVar120 = vfmsub231ps_avx512vl(auVar121,auVar145,auVar39);
          auVar40._8_4_ = 0x395e8083;
          auVar40._0_8_ = 0x395e8083395e8083;
          auVar40._12_4_ = 0x395e8083;
          auVar122 = vfmsub231ps_avx512vl(auVar120,auVar145,auVar40);
          auVar230._8_4_ = 0x39506967;
          auVar230._0_8_ = 0x3950696739506967;
          auVar230._12_4_ = 0x39506967;
          auVar41._8_4_ = 0x3ab743ce;
          auVar41._0_8_ = 0x3ab743ce3ab743ce;
          auVar41._12_4_ = 0x3ab743ce;
          auVar120 = vfmadd213ps_avx512vl(auVar230,auVar122,auVar41);
          auVar42._8_4_ = 0x3c088908;
          auVar42._0_8_ = 0x3c0889083c088908;
          auVar42._12_4_ = 0x3c088908;
          auVar120 = vfmadd213ps_avx512vl(auVar120,auVar122,auVar42);
          auVar43._8_4_ = 0x3d2aa9c1;
          auVar43._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar43._12_4_ = 0x3d2aa9c1;
          auVar120 = vfmadd213ps_avx512vl(auVar120,auVar122,auVar43);
          auVar234._0_4_ = auVar122._0_4_ * auVar122._0_4_;
          auVar234._4_4_ = auVar122._4_4_ * auVar122._4_4_;
          auVar234._8_4_ = auVar122._8_4_ * auVar122._8_4_;
          auVar234._12_4_ = auVar122._12_4_ * auVar122._12_4_;
          auVar44._8_4_ = 0x3e2aaaaa;
          auVar44._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar44._12_4_ = 0x3e2aaaaa;
          auVar120 = vfmadd213ps_avx512vl(auVar120,auVar122,auVar44);
          auVar120 = vfmadd213ps_fma(auVar120,auVar122,auVar205);
          auVar120 = vfmadd213ps_fma(auVar120,auVar234,auVar122);
          auVar200._0_4_ = auVar120._0_4_ + 1.0;
          auVar200._4_4_ = auVar120._4_4_ + 1.0;
          auVar200._8_4_ = auVar120._8_4_ + 1.0;
          auVar200._12_4_ = auVar120._12_4_ + 1.0;
          auVar206._0_4_ = (int)auVar145._0_4_;
          auVar206._4_4_ = (int)auVar145._4_4_;
          auVar206._8_4_ = (int)auVar145._8_4_;
          auVar206._12_4_ = (int)auVar145._12_4_;
          auVar120 = vpslld_avx(auVar206,0x17);
          auVar45._8_4_ = 0x3f800000;
          auVar45._0_8_ = 0x3f8000003f800000;
          auVar45._12_4_ = 0x3f800000;
          auVar120 = vpaddd_avx512vl(auVar120,auVar45);
          auVar120 = vfmadd213ps_fma(auVar120,auVar200,auVar217);
          auVar122 = vdivps_avx(auVar217,auVar120);
          break;
        case 5:
          auVar237._8_4_ = 0x42b0c0a5;
          auVar237._0_8_ = 0x42b0c0a542b0c0a5;
          auVar237._12_4_ = 0x42b0c0a5;
          auVar240._8_4_ = 0xc2b0c0a5;
          auVar240._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar240._12_4_ = 0xc2b0c0a5;
          auVar120 = vminps_avx(auVar122,auVar237);
          auVar121 = vmaxps_avx(auVar120,auVar240);
          auVar228._8_4_ = 0x3fb8aa3b;
          auVar228._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar228._12_4_ = 0x3fb8aa3b;
          auVar214._8_4_ = 0x3f000000;
          auVar214._0_8_ = 0x3f0000003f000000;
          auVar214._12_4_ = 0x3f000000;
          auVar123 = vfmadd213ps_fma(auVar228,auVar121,auVar214);
          auVar222._0_4_ = (int)auVar123._0_4_;
          auVar222._4_4_ = (int)auVar123._4_4_;
          auVar222._8_4_ = (int)auVar123._8_4_;
          auVar222._12_4_ = (int)auVar123._12_4_;
          auVar120 = vcvtdq2ps_avx(auVar222);
          uVar101 = vcmpps_avx512vl(auVar123,auVar120,1);
          auVar203._8_4_ = 0x3f800000;
          auVar203._0_8_ = 0x3f8000003f800000;
          auVar203._12_4_ = 0x3f800000;
          auVar223._8_4_ = 0x3f318000;
          auVar223._0_8_ = 0x3f3180003f318000;
          auVar223._12_4_ = 0x3f318000;
          auVar123 = vsubps_avx512vl(auVar120,auVar203);
          bVar14 = (bool)((byte)uVar101 & 1);
          auVar140._0_4_ = (float)((uint)bVar14 * auVar123._0_4_ | (uint)!bVar14 * auVar120._0_4_);
          bVar14 = (bool)((byte)(uVar101 >> 1) & 1);
          auVar140._4_4_ = (float)((uint)bVar14 * auVar123._4_4_ | (uint)!bVar14 * auVar120._4_4_);
          bVar14 = (bool)((byte)(uVar101 >> 2) & 1);
          auVar140._8_4_ = (float)((uint)bVar14 * auVar123._8_4_ | (uint)!bVar14 * auVar120._8_4_);
          bVar14 = (bool)((byte)(uVar101 >> 3) & 1);
          auVar140._12_4_ =
               (float)((uint)bVar14 * auVar123._12_4_ | (uint)!bVar14 * auVar120._12_4_);
          auVar120 = vfmsub231ps_fma(auVar121,auVar140,auVar223);
          auVar244._8_4_ = 0xb95e8083;
          auVar244._0_8_ = 0xb95e8083b95e8083;
          auVar244._12_4_ = 0xb95e8083;
          auVar120 = vfnmsub231ps_fma(auVar120,auVar140,auVar244);
          auVar121 = vmulps_avx512vl(auVar120,auVar120);
          auVar248._8_4_ = 0x3ab743ce;
          auVar248._0_8_ = 0x3ab743ce3ab743ce;
          auVar248._12_4_ = 0x3ab743ce;
          auVar233._8_4_ = 0x39506967;
          auVar233._0_8_ = 0x3950696739506967;
          auVar233._12_4_ = 0x39506967;
          auVar123 = vfmadd213ps_avx512vl(auVar233,auVar120,auVar248);
          auVar250._8_4_ = 0x3c088908;
          auVar250._0_8_ = 0x3c0889083c088908;
          auVar250._12_4_ = 0x3c088908;
          auVar252._8_4_ = 0x3d2aa9c1;
          auVar252._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar252._12_4_ = 0x3d2aa9c1;
          auVar123 = vfmadd213ps_avx512vl(auVar123,auVar120,auVar250);
          auVar123 = vfmadd213ps_avx512vl(auVar123,auVar120,auVar252);
          auVar254._8_4_ = 0x3e2aaaaa;
          auVar254._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar254._12_4_ = 0x3e2aaaaa;
          auVar123 = vfmadd213ps_avx512vl(auVar123,auVar120,auVar254);
          auVar123 = vfmadd213ps_avx512vl(auVar123,auVar120,auVar214);
          auVar120 = vfmadd213ps_avx512vl(auVar123,auVar121,auVar120);
          auVar121 = vaddps_avx512vl(auVar120,auVar203);
          auVar257._0_4_ = (int)auVar140._0_4_;
          auVar257._4_4_ = (int)auVar140._4_4_;
          auVar257._8_4_ = (int)auVar140._8_4_;
          auVar257._12_4_ = (int)auVar140._12_4_;
          auVar120 = vpslld_avx(auVar257,0x17);
          auVar258._8_4_ = 0x3f800000;
          auVar258._0_8_ = 0x3f8000003f800000;
          auVar258._12_4_ = 0x3f800000;
          auVar120 = vpaddd_avx(auVar120,auVar258);
          auVar120 = vfmadd213ps_avx512vl(auVar120,auVar121,auVar203);
          auVar124._8_4_ = 0x800000;
          auVar124._0_8_ = 0x80000000800000;
          auVar124._12_4_ = 0x800000;
          auVar121 = vmaxps_avx512vl(auVar120,auVar124);
          uVar101 = vcmpps_avx512vl(auVar120,(undefined1  [16])0x0,2);
          auVar120 = vpsrld_avx512vl(auVar121,0x17);
          auVar263._8_4_ = 0x3f000000;
          auVar263._0_8_ = 0x3f0000003f000000;
          auVar263._12_4_ = 0x3f000000;
          auVar125._8_4_ = 0x807fffff;
          auVar125._0_8_ = 0x807fffff807fffff;
          auVar125._12_4_ = 0x807fffff;
          auVar121 = vpternlogd_avx512vl(auVar263,auVar121,auVar125,0xf8);
          auVar126._8_4_ = 0xffffff82;
          auVar126._0_8_ = 0xffffff82ffffff82;
          auVar126._12_4_ = 0xffffff82;
          auVar120 = vpaddd_avx512vl(auVar120,auVar126);
          auVar127._8_4_ = 0x3f3504f3;
          auVar127._0_8_ = 0x3f3504f33f3504f3;
          auVar127._12_4_ = 0x3f3504f3;
          uVar16 = vcmpps_avx512vl(auVar121,auVar127,1);
          auVar199._8_4_ = 0xbf800000;
          auVar199._0_8_ = 0xbf800000bf800000;
          auVar199._12_4_ = 0xbf800000;
          auVar123 = vaddps_avx512vl(auVar121,auVar199);
          auVar120 = vcvtdq2ps_avx(auVar120);
          auVar124 = vsubps_avx512vl(auVar120,auVar203);
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar141._0_4_ = (uint)bVar14 * auVar124._0_4_ | (uint)!bVar14 * auVar120._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar141._4_4_ = (uint)bVar14 * auVar124._4_4_ | (uint)!bVar14 * auVar120._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar141._8_4_ = (uint)bVar14 * auVar124._8_4_ | (uint)!bVar14 * auVar120._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar141._12_4_ = (uint)bVar14 * auVar124._12_4_ | (uint)!bVar14 * auVar120._12_4_;
          auVar120 = vaddps_avx512vl(auVar123,auVar121);
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar142._0_4_ = (uint)bVar14 * auVar120._0_4_ | (uint)!bVar14 * auVar123._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar142._4_4_ = (uint)bVar14 * auVar120._4_4_ | (uint)!bVar14 * auVar123._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar142._8_4_ = (uint)bVar14 * auVar120._8_4_ | (uint)!bVar14 * auVar123._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar142._12_4_ = (uint)bVar14 * auVar120._12_4_ | (uint)!bVar14 * auVar123._12_4_;
          auVar120 = vmulps_avx512vl(auVar142,auVar142);
          auVar121 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar132._8_4_ = 0xbdebd1b8;
          auVar132._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar132._12_4_ = 0xbdebd1b8;
          auVar121 = vfmadd213ps_avx512vl(auVar121,auVar142,auVar132);
          auVar128._8_4_ = 0x3def251a;
          auVar128._0_8_ = 0x3def251a3def251a;
          auVar128._12_4_ = 0x3def251a;
          auVar121 = vfmadd213ps_avx512vl(auVar121,auVar142,auVar128);
          auVar130._8_4_ = 0xbdfe5d4f;
          auVar130._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar130._12_4_ = 0xbdfe5d4f;
          auVar121 = vfmadd213ps_avx512vl(auVar121,auVar142,auVar130);
          auVar131._8_4_ = 0x3e11e9bf;
          auVar131._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar131._12_4_ = 0x3e11e9bf;
          auVar121 = vfmadd213ps_avx512vl(auVar121,auVar142,auVar131);
          auVar32._8_4_ = 0xbe2aae50;
          auVar32._0_8_ = 0xbe2aae50be2aae50;
          auVar32._12_4_ = 0xbe2aae50;
          auVar121 = vfmadd213ps_avx512vl(auVar121,auVar142,auVar32);
          auVar33._8_4_ = 0x3e4cceac;
          auVar33._0_8_ = 0x3e4cceac3e4cceac;
          auVar33._12_4_ = 0x3e4cceac;
          auVar121 = vfmadd213ps_avx512vl(auVar121,auVar142,auVar33);
          auVar34._8_4_ = 0xbe7ffffc;
          auVar34._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar34._12_4_ = 0xbe7ffffc;
          auVar121 = vfmadd213ps_avx512vl(auVar121,auVar142,auVar34);
          auVar35._8_4_ = 0x3eaaaaaa;
          auVar35._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar35._12_4_ = 0x3eaaaaaa;
          auVar121 = vfmadd213ps_avx512vl(auVar121,auVar142,auVar35);
          auVar123 = vmulps_avx512vl(auVar120,auVar142);
          auVar121 = vmulps_avx512vl(auVar123,auVar121);
          auVar121 = vfmadd231ps_avx512vl(auVar121,auVar141,auVar244);
          auVar120 = vfmsub231ps_avx512vl(auVar121,auVar214,auVar120);
          auVar120 = vsubps_avx512vl(auVar120,auVar142);
          auVar120 = vfnmadd231ps_fma(auVar120,auVar223,auVar141);
          auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar14 = (bool)((byte)uVar101 & 1);
          auVar143._0_4_ =
               (uint)bVar14 * auVar121._0_4_ |
               (uint)!bVar14 * (int)(auVar120._0_4_ + auVar120._0_4_);
          bVar14 = (bool)((byte)(uVar101 >> 1) & 1);
          auVar143._4_4_ =
               (uint)bVar14 * auVar121._4_4_ |
               (uint)!bVar14 * (int)(auVar120._4_4_ + auVar120._4_4_);
          bVar14 = (bool)((byte)(uVar101 >> 2) & 1);
          auVar143._8_4_ =
               (uint)bVar14 * auVar121._8_4_ |
               (uint)!bVar14 * (int)(auVar120._8_4_ + auVar120._8_4_);
          bVar14 = (bool)((byte)(uVar101 >> 3) & 1);
          auVar143._12_4_ =
               (uint)bVar14 * auVar121._12_4_ |
               (uint)!bVar14 * (int)(auVar120._12_4_ + auVar120._12_4_);
          auVar120 = vminps_avx(auVar143,auVar237);
          auVar121 = vmaxps_avx(auVar120,auVar240);
          auVar123 = vfmadd213ps_fma(auVar228,auVar121,auVar214);
          auVar241._0_4_ = (int)auVar123._0_4_;
          auVar241._4_4_ = (int)auVar123._4_4_;
          auVar241._8_4_ = (int)auVar123._8_4_;
          auVar241._12_4_ = (int)auVar123._12_4_;
          auVar120 = vcvtdq2ps_avx(auVar241);
          uVar101 = vcmpps_avx512vl(auVar123,auVar120,1);
          auVar123 = vsubps_avx512vl(auVar120,auVar203);
          bVar14 = (bool)((byte)uVar101 & 1);
          auVar144._0_4_ = (float)((uint)bVar14 * auVar123._0_4_ | (uint)!bVar14 * auVar120._0_4_);
          bVar14 = (bool)((byte)(uVar101 >> 1) & 1);
          auVar144._4_4_ = (float)((uint)bVar14 * auVar123._4_4_ | (uint)!bVar14 * auVar120._4_4_);
          bVar14 = (bool)((byte)(uVar101 >> 2) & 1);
          auVar144._8_4_ = (float)((uint)bVar14 * auVar123._8_4_ | (uint)!bVar14 * auVar120._8_4_);
          bVar14 = (bool)((byte)(uVar101 >> 3) & 1);
          auVar144._12_4_ =
               (float)((uint)bVar14 * auVar123._12_4_ | (uint)!bVar14 * auVar120._12_4_);
          auVar120 = vfmsub213ps_fma(auVar223,auVar144,auVar121);
          auVar121 = vfnmsub231ps_fma(auVar120,auVar144,auVar244);
          auVar229._0_4_ = auVar121._0_4_ * auVar121._0_4_;
          auVar229._4_4_ = auVar121._4_4_ * auVar121._4_4_;
          auVar229._8_4_ = auVar121._8_4_ * auVar121._8_4_;
          auVar229._12_4_ = auVar121._12_4_ * auVar121._12_4_;
          auVar120 = vfmadd213ps_fma(auVar233,auVar121,auVar248);
          auVar120 = vfmadd213ps_fma(auVar120,auVar121,auVar250);
          auVar120 = vfmadd213ps_fma(auVar120,auVar121,auVar252);
          auVar120 = vfmadd213ps_fma(auVar120,auVar121,auVar254);
          auVar120 = vfmadd213ps_fma(auVar120,auVar121,auVar214);
          auVar120 = vfmadd213ps_fma(auVar120,auVar229,auVar121);
          auVar215._0_4_ = auVar120._0_4_ + 1.0;
          auVar215._4_4_ = auVar120._4_4_ + 1.0;
          auVar215._8_4_ = auVar120._8_4_ + 1.0;
          auVar215._12_4_ = auVar120._12_4_ + 1.0;
          auVar224._0_4_ = (int)auVar144._0_4_;
          auVar224._4_4_ = (int)auVar144._4_4_;
          auVar224._8_4_ = (int)auVar144._8_4_;
          auVar224._12_4_ = (int)auVar144._12_4_;
          auVar120 = vpslld_avx(auVar224,0x17);
          auVar120 = vpaddd_avx(auVar258,auVar120);
          auVar120 = vfmadd213ps_fma(auVar120,auVar215,auVar203);
          auVar204._8_4_ = 0x40000000;
          auVar204._0_8_ = 0x4000000040000000;
          auVar204._12_4_ = 0x40000000;
          auVar120 = vdivps_avx(auVar204,auVar120);
          auVar122 = vfmsub231ps_fma(auVar122,auVar122,auVar120);
          break;
        case 6:
          puVar10 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar6 = *puVar10;
          auVar123._4_4_ = uVar6;
          auVar123._0_4_ = uVar6;
          auVar123._8_4_ = uVar6;
          auVar123._12_4_ = uVar6;
          uVar6 = puVar10[1];
          auVar120._4_4_ = uVar6;
          auVar120._0_4_ = uVar6;
          auVar120._8_4_ = uVar6;
          auVar120._12_4_ = uVar6;
          auVar120 = vfmadd213ps_avx512vl(auVar123,auVar122,auVar120);
          auVar120 = vmaxps_avx(auVar120,ZEXT816(0) << 0x20);
          auVar121._8_4_ = 0x3f800000;
          auVar121._0_8_ = 0x3f8000003f800000;
          auVar121._12_4_ = 0x3f800000;
          auVar120 = vminps_avx512vl(auVar120,auVar121);
          auVar122._0_4_ = auVar120._0_4_ * auVar122._0_4_;
          auVar122._4_4_ = auVar120._4_4_ * auVar122._4_4_;
          auVar122._8_4_ = auVar120._8_4_ * auVar122._8_4_;
          auVar122._12_4_ = auVar120._12_4_ * auVar122._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar99 * 4) = auVar122;
      }
      iVar109 = (int)uVar99 + (uVar110 >> 2 & 1) * 4;
      iVar97 = 0;
      if ((int)uVar110 <= iVar109) goto LAB_002cff3d;
      pfVar13 = (float *)(this->super_InnerProduct).activation_params.data;
      pvVar103 = (this->weight_data_tm).data;
      pvVar12 = top_blob->data;
      local_158 = uVar118 & 0xfffffff8;
      uVar99 = (ulong)iVar109;
      auVar187 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar186 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        fVar198 = 0.0;
        if (pvVar9 != (void *)0x0) {
          fVar198 = *(float *)((long)pvVar9 + uVar99 * 4);
        }
        pauVar107 = (undefined1 (*) [32])((long)pvVar103 + uVar99 * lVar111 * 4);
        pauVar100 = pauVar108;
        if ((int)uVar118 < 8) {
          auVar147 = SUB6432(ZEXT864(0),0);
          uVar110 = 0;
        }
        else {
          auVar188 = ZEXT864(0);
          iVar97 = 7;
          do {
            auVar120 = vfmadd231ps_fma(auVar188._0_32_,*pauVar100,*pauVar107);
            auVar188 = ZEXT1664(auVar120);
            auVar147 = ZEXT1632(auVar120);
            pauVar100 = pauVar100 + 1;
            pauVar107 = pauVar107 + 1;
            iVar97 = iVar97 + 8;
            uVar110 = local_158;
          } while (iVar97 < (int)uVar118);
        }
        auVar120 = ZEXT816(0) << 0x40;
        uVar113 = uVar110 | 3;
        while ((int)uVar113 < (int)uVar118) {
          auVar120 = vfmadd231ps_fma(auVar120,*(undefined1 (*) [16])*pauVar100,
                                     *(undefined1 (*) [16])*pauVar107);
          pauVar100 = (undefined1 (*) [32])(*pauVar100 + 0x10);
          pauVar107 = (undefined1 (*) [32])(*pauVar107 + 0x10);
          uVar113 = uVar110 + 7;
          uVar110 = uVar110 + 4;
        }
        if ((int)uVar110 < (int)uVar118) {
          auVar189 = vpbroadcastq_avx512f();
          uVar101 = 0;
          auVar188 = ZEXT1264(CONCAT84(SUB128(ZEXT812(0),4),fVar198));
          do {
            auVar191 = auVar188;
            auVar188 = vpbroadcastq_avx512f();
            auVar190 = vporq_avx512f(auVar188,auVar187);
            auVar188 = vporq_avx512f(auVar188,auVar186);
            uVar18 = vpcmpuq_avx512f(auVar188,auVar189,2);
            bVar15 = (byte)uVar18;
            uVar18 = vpcmpuq_avx512f(auVar190,auVar189,2);
            bVar78 = (byte)uVar18;
            uVar119 = CONCAT11(bVar78,bVar15);
            piVar8 = (int *)(*pauVar100 + uVar101 * 4);
            auVar188._4_4_ = (uint)((byte)(uVar119 >> 1) & 1) * piVar8[1];
            auVar188._0_4_ = (uint)(bVar15 & 1) * *piVar8;
            auVar188._8_4_ = (uint)((byte)(uVar119 >> 2) & 1) * piVar8[2];
            auVar188._12_4_ = (uint)((byte)(uVar119 >> 3) & 1) * piVar8[3];
            auVar188._16_4_ = (uint)((byte)(uVar119 >> 4) & 1) * piVar8[4];
            auVar188._20_4_ = (uint)((byte)(uVar119 >> 5) & 1) * piVar8[5];
            auVar188._24_4_ = (uint)((byte)(uVar119 >> 6) & 1) * piVar8[6];
            auVar188._28_4_ = (uint)((byte)(uVar119 >> 7) & 1) * piVar8[7];
            auVar188._32_4_ = (uint)(bVar78 & 1) * piVar8[8];
            auVar188._36_4_ = (uint)(bVar78 >> 1 & 1) * piVar8[9];
            auVar188._40_4_ = (uint)(bVar78 >> 2 & 1) * piVar8[10];
            auVar188._44_4_ = (uint)(bVar78 >> 3 & 1) * piVar8[0xb];
            auVar188._48_4_ = (uint)(bVar78 >> 4 & 1) * piVar8[0xc];
            auVar188._52_4_ = (uint)(bVar78 >> 5 & 1) * piVar8[0xd];
            auVar188._56_4_ = (uint)(bVar78 >> 6 & 1) * piVar8[0xe];
            auVar188._60_4_ = (uint)(bVar78 >> 7) * piVar8[0xf];
            piVar8 = (int *)(*pauVar107 + uVar101 * 4);
            auVar190._4_4_ = (uint)((byte)(uVar119 >> 1) & 1) * piVar8[1];
            auVar190._0_4_ = (uint)(bVar15 & 1) * *piVar8;
            auVar190._8_4_ = (uint)((byte)(uVar119 >> 2) & 1) * piVar8[2];
            auVar190._12_4_ = (uint)((byte)(uVar119 >> 3) & 1) * piVar8[3];
            auVar190._16_4_ = (uint)((byte)(uVar119 >> 4) & 1) * piVar8[4];
            auVar190._20_4_ = (uint)((byte)(uVar119 >> 5) & 1) * piVar8[5];
            auVar190._24_4_ = (uint)((byte)(uVar119 >> 6) & 1) * piVar8[6];
            auVar190._28_4_ = (uint)((byte)(uVar119 >> 7) & 1) * piVar8[7];
            auVar190._32_4_ = (uint)(bVar78 & 1) * piVar8[8];
            auVar190._36_4_ = (uint)(bVar78 >> 1 & 1) * piVar8[9];
            auVar190._40_4_ = (uint)(bVar78 >> 2 & 1) * piVar8[10];
            auVar190._44_4_ = (uint)(bVar78 >> 3 & 1) * piVar8[0xb];
            auVar190._48_4_ = (uint)(bVar78 >> 4 & 1) * piVar8[0xc];
            auVar190._52_4_ = (uint)(bVar78 >> 5 & 1) * piVar8[0xd];
            auVar190._56_4_ = (uint)(bVar78 >> 6 & 1) * piVar8[0xe];
            auVar190._60_4_ = (uint)(bVar78 >> 7) * piVar8[0xf];
            auVar188 = vfmadd213ps_avx512f(auVar190,auVar188,auVar191);
            uVar101 = uVar101 + 0x10;
          } while (((ulong)(~uVar110 + uVar118) + 0x10 & 0xfffffffffffffff0) != uVar101);
          auVar189._0_4_ =
               (uint)(bVar15 & 1) * auVar188._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar191._0_4_;
          bVar14 = (bool)((byte)(uVar119 >> 1) & 1);
          auVar189._4_4_ = (uint)bVar14 * auVar188._4_4_ | (uint)!bVar14 * auVar191._4_4_;
          bVar14 = (bool)((byte)(uVar119 >> 2) & 1);
          auVar189._8_4_ = (uint)bVar14 * auVar188._8_4_ | (uint)!bVar14 * auVar191._8_4_;
          bVar14 = (bool)((byte)(uVar119 >> 3) & 1);
          auVar189._12_4_ = (uint)bVar14 * auVar188._12_4_ | (uint)!bVar14 * auVar191._12_4_;
          bVar14 = (bool)((byte)(uVar119 >> 4) & 1);
          auVar189._16_4_ = (uint)bVar14 * auVar188._16_4_ | (uint)!bVar14 * auVar191._16_4_;
          bVar14 = (bool)((byte)(uVar119 >> 5) & 1);
          auVar189._20_4_ = (uint)bVar14 * auVar188._20_4_ | (uint)!bVar14 * auVar191._20_4_;
          bVar14 = (bool)((byte)(uVar119 >> 6) & 1);
          auVar189._24_4_ = (uint)bVar14 * auVar188._24_4_ | (uint)!bVar14 * auVar191._24_4_;
          bVar14 = (bool)((byte)(uVar119 >> 7) & 1);
          auVar189._28_4_ = (uint)bVar14 * auVar188._28_4_ | (uint)!bVar14 * auVar191._28_4_;
          auVar189._32_4_ =
               (uint)(bVar78 & 1) * auVar188._32_4_ | (uint)!(bool)(bVar78 & 1) * auVar191._32_4_;
          bVar14 = (bool)(bVar78 >> 1 & 1);
          auVar189._36_4_ = (uint)bVar14 * auVar188._36_4_ | (uint)!bVar14 * auVar191._36_4_;
          bVar14 = (bool)(bVar78 >> 2 & 1);
          auVar189._40_4_ = (uint)bVar14 * auVar188._40_4_ | (uint)!bVar14 * auVar191._40_4_;
          bVar14 = (bool)(bVar78 >> 3 & 1);
          auVar189._44_4_ = (uint)bVar14 * auVar188._44_4_ | (uint)!bVar14 * auVar191._44_4_;
          bVar14 = (bool)(bVar78 >> 4 & 1);
          auVar189._48_4_ = (uint)bVar14 * auVar188._48_4_ | (uint)!bVar14 * auVar191._48_4_;
          bVar14 = (bool)(bVar78 >> 5 & 1);
          auVar189._52_4_ = (uint)bVar14 * auVar188._52_4_ | (uint)!bVar14 * auVar191._52_4_;
          bVar14 = (bool)(bVar78 >> 6 & 1);
          auVar189._56_4_ = (uint)bVar14 * auVar188._56_4_ | (uint)!bVar14 * auVar191._56_4_;
          auVar189._60_4_ =
               (uint)(bVar78 >> 7) * auVar188._60_4_ | (uint)!(bool)(bVar78 >> 7) * auVar191._60_4_;
          auVar148 = vextractf64x4_avx512f(auVar189,1);
          auVar188 = vaddps_avx512f(auVar189,ZEXT3264(auVar148));
          auVar207._0_4_ = auVar188._0_4_ + auVar188._16_4_;
          auVar207._4_4_ = auVar188._4_4_ + auVar188._20_4_;
          auVar207._8_4_ = auVar188._8_4_ + auVar188._24_4_;
          auVar207._12_4_ = auVar188._12_4_ + auVar188._28_4_;
          auVar122 = vshufpd_avx(auVar207,auVar207,1);
          auVar208._0_4_ = auVar207._0_4_ + auVar122._0_4_;
          auVar208._4_4_ = auVar207._4_4_ + auVar122._4_4_;
          auVar208._8_4_ = auVar207._8_4_ + auVar122._8_4_;
          auVar208._12_4_ = auVar207._12_4_ + auVar122._12_4_;
          auVar122 = vhaddps_avx(auVar208,auVar208);
          fVar198 = auVar122._0_4_;
        }
        auVar201._0_4_ = auVar147._0_4_ + auVar147._16_4_ + auVar120._0_4_;
        auVar201._4_4_ = auVar147._4_4_ + auVar147._20_4_ + auVar120._4_4_;
        auVar201._8_4_ = auVar147._8_4_ + auVar147._24_4_ + auVar120._8_4_;
        auVar201._12_4_ = auVar147._12_4_ + auVar147._28_4_ + auVar120._12_4_;
        auVar120 = vhaddps_avx(auVar201,auVar201);
        auVar120 = vhaddps_avx(auVar120,auVar120);
        fVar198 = auVar120._0_4_ + fVar198;
        fVar197 = fVar198;
        if (uVar98 - 1 < 6) {
          auVar120 = ZEXT416((uint)fVar198);
          switch(uVar98) {
          case 1:
            auVar120 = vmaxss_avx(auVar120,ZEXT416(0));
            fVar197 = auVar120._0_4_;
            break;
          case 2:
            uVar18 = vcmpss_avx512f(auVar120,ZEXT416(0),0xe);
            bVar14 = (bool)((byte)uVar18 & 1);
            fVar197 = (float)((uint)bVar14 * 0x3f800000 + (uint)!bVar14 * (int)*pfVar13) * fVar198;
            break;
          case 3:
            auVar120 = vmaxss_avx(auVar120,ZEXT416((uint)*pfVar13));
            fVar197 = auVar120._0_4_;
            if (pfVar13[1] < auVar120._0_4_) {
              fVar197 = pfVar13[1];
            }
            break;
          case 4:
            auVar120 = vminss_avx(auVar120,SUB6416(ZEXT464(0x42b0c0a5),0));
            auVar50._8_4_ = 0x80000000;
            auVar50._0_8_ = 0x8000000080000000;
            auVar50._12_4_ = 0x80000000;
            auVar122 = vxorps_avx512vl(auVar120,auVar50);
            uVar18 = vcmpss_avx512f(auVar120,ZEXT416(0xc2b0c0a5),1);
            bVar14 = (bool)((byte)uVar18 & 1);
            fVar198 = expf((float)((uint)bVar14 * 0x42b0c0a5 + (uint)!bVar14 * auVar122._0_4_));
            auVar186 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar187 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            fVar197 = 1.0 / (fVar198 + 1.0);
            break;
          case 5:
            fVar197 = expf(fVar198);
            fVar197 = logf(fVar197 + 1.0);
            fVar197 = tanhf(fVar197);
            auVar186 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar187 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            fVar197 = fVar197 * fVar198;
            break;
          case 6:
            fVar7 = *pfVar13;
            auVar49._8_4_ = 0x80000000;
            auVar49._0_8_ = 0x8000000080000000;
            auVar49._12_4_ = 0x80000000;
            auVar120 = vxorps_avx512vl(ZEXT416((uint)pfVar13[1]),auVar49);
            fVar220 = auVar120._0_4_ / fVar7;
            fVar197 = 0.0;
            if ((fVar220 <= fVar198) && (fVar197 = fVar198, fVar198 <= fVar220 + 1.0 / fVar7)) {
              auVar120 = vfmadd213ss_fma(ZEXT416((uint)fVar7),ZEXT416((uint)fVar198),
                                         ZEXT416((uint)pfVar13[1]));
              fVar197 = auVar120._0_4_ * fVar198;
            }
          }
        }
        *(float *)((long)pvVar12 + uVar99 * 4) = fVar197;
        uVar99 = uVar99 + 1;
      } while (uVar99 != local_e0);
    }
    else if ((iVar97 == 4) && (0 < (int)uVar110)) {
      uVar101 = 0;
      auVar199 = ZEXT816(0) << 0x40;
      auVar213._8_4_ = 0x42b0c0a5;
      auVar213._0_8_ = 0x42b0c0a542b0c0a5;
      auVar213._12_4_ = 0x42b0c0a5;
      auVar221._8_4_ = 0xc2b0c0a5;
      auVar221._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar221._12_4_ = 0xc2b0c0a5;
      auVar227._8_4_ = 0x3f000000;
      auVar227._0_8_ = 0x3f0000003f000000;
      auVar227._12_4_ = 0x3f000000;
      auVar232._8_4_ = 0x3fb8aa3b;
      auVar232._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar232._12_4_ = 0x3fb8aa3b;
      auVar236._8_4_ = 0x3f800000;
      auVar236._0_8_ = 0x3f8000003f800000;
      auVar236._12_4_ = 0x3f800000;
      auVar239._8_4_ = 0x3f318000;
      auVar239._0_8_ = 0x3f3180003f318000;
      auVar239._12_4_ = 0x3f318000;
      auVar247._8_4_ = 0x39506967;
      auVar247._0_8_ = 0x3950696739506967;
      auVar247._12_4_ = 0x39506967;
      auVar249._8_4_ = 0x3ab743ce;
      auVar249._0_8_ = 0x3ab743ce3ab743ce;
      auVar249._12_4_ = 0x3ab743ce;
      auVar251._8_4_ = 0x3c088908;
      auVar251._0_8_ = 0x3c0889083c088908;
      auVar251._12_4_ = 0x3c088908;
      auVar253._8_4_ = 0x3d2aa9c1;
      auVar253._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar253._12_4_ = 0x3d2aa9c1;
      auVar256._8_4_ = 0x3e2aaaaa;
      auVar256._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar256._12_4_ = 0x3e2aaaaa;
      auVar260._8_4_ = 0x3f800000;
      auVar260._0_8_ = 0x3f8000003f800000;
      auVar260._12_4_ = 0x3f800000;
      auVar262._8_4_ = 0xb95e8083;
      auVar262._0_8_ = 0xb95e8083b95e8083;
      auVar262._12_4_ = 0xb95e8083;
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar127 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      do {
        auVar132 = ZEXT816(0) << 0x40;
        if (pvVar9 != (void *)0x0) {
          auVar132 = *(undefined1 (*) [16])((long)pvVar9 + uVar101 * 0x10);
        }
        pauVar108 = (undefined1 (*) [32])
                    ((long)(this->weight_data_tm).w * uVar101 * (this->weight_data_tm).elemsize +
                    (long)(this->weight_data_tm).data);
        auVar128 = in_ZMM17._0_16_;
        auVar130 = in_ZMM18._0_16_;
        auVar129 = in_ZMM16._0_16_;
        pauVar107 = local_128;
        if ((int)uVar118 < 8) {
          auVar129 = vxorps_avx512vl(auVar129,auVar129);
          auVar147 = ZEXT1632(auVar129);
          auVar129 = vxorps_avx512vl(auVar130,auVar130);
          in_ZMM18 = ZEXT1664(auVar129);
          auVar129 = vxorps_avx512vl(auVar128,auVar128);
          in_ZMM17 = ZEXT1664(auVar129);
          auVar186 = ZEXT864(0);
          uVar110 = 0;
        }
        else {
          auVar186 = ZEXT864(0);
          iVar97 = 7;
          auVar128 = vxorps_avx512vl(auVar128,auVar128);
          in_ZMM17 = ZEXT1664(auVar128);
          auVar128 = vxorps_avx512vl(auVar130,auVar130);
          in_ZMM18 = ZEXT1664(auVar128);
          auVar129 = vxorps_avx512vl(auVar129,auVar129);
          auVar187 = ZEXT1664(auVar129);
          do {
            auVar129 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar107));
            auVar128 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar107 + 4)));
            auVar130 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar107 + 8)));
            auVar131 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar107 + 0xc)));
            auVar147 = vinsertf32x4_avx512vl(ZEXT1632(auVar129),auVar128,1);
            auVar148 = vinsertf32x4_avx512vl(ZEXT1632(auVar130),auVar131,1);
            auVar129 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar107 + 0x10)));
            auVar128 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar107 + 0x14)));
            auVar130 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar107 + 0x18)));
            auVar149 = vinsertf32x4_avx512vl(ZEXT1632(auVar129),auVar128,1);
            auVar129 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar107 + 0x1c)));
            auVar150 = vinsertf32x4_avx512vl(ZEXT1632(auVar130),auVar129,1);
            auVar147 = vfmadd231ps_avx512vl(auVar186._0_32_,auVar147,*pauVar108);
            auVar186 = ZEXT3264(auVar147);
            auVar147 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar148,pauVar108[1]);
            in_ZMM17 = ZEXT3264(auVar147);
            auVar147 = vfmadd231ps_avx512vl(in_ZMM18._0_32_,auVar149,pauVar108[2]);
            in_ZMM18 = ZEXT3264(auVar147);
            auVar147 = vfmadd231ps_avx512vl(auVar187._0_32_,auVar150,pauVar108[3]);
            auVar187 = ZEXT3264(auVar147);
            pauVar107 = pauVar107 + 1;
            pauVar108 = pauVar108 + 4;
            iVar97 = iVar97 + 8;
            uVar110 = uVar118 & 0xfffffff8;
          } while (iVar97 < (int)uVar118);
        }
        auVar148 = auVar186._0_32_;
        uVar113 = uVar110 | 3;
        while ((int)uVar113 < (int)uVar118) {
          auVar129 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar107));
          auVar128 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar107 + 4)));
          auVar130 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar107 + 8)));
          auVar131 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar107 + 0xc)));
          auVar148 = vinsertf32x4_avx512vl(ZEXT1632(auVar129),auVar128,1);
          auVar149 = vinsertf32x4_avx512vl(ZEXT1632(auVar130),auVar131,1);
          auVar148 = vfmadd231ps_avx512vl(auVar186._0_32_,auVar148,*pauVar108);
          auVar186 = ZEXT3264(auVar148);
          auVar149 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar149,pauVar108[1]);
          in_ZMM17 = ZEXT3264(auVar149);
          pauVar107 = (undefined1 (*) [32])(*pauVar107 + 0x10);
          pauVar108 = pauVar108 + 2;
          uVar113 = uVar110 + 7;
          uVar110 = uVar110 + 4;
        }
        if (uVar118 - uVar110 != 0 && (int)uVar110 <= (int)uVar118) {
          lVar111 = 0;
          do {
            auVar129 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar107 + lVar111 * 4)));
            auVar132 = vfmadd231ps_avx512vl(auVar132,auVar129,*(undefined1 (*) [16])*pauVar108);
            pauVar108 = (undefined1 (*) [32])(*pauVar108 + 0x10);
            lVar111 = lVar111 + 1;
          } while (uVar118 - uVar110 != (int)lVar111);
        }
        auVar147 = vaddps_avx512vl(in_ZMM18._0_32_,auVar147);
        auVar148 = vaddps_avx512vl(in_ZMM17._0_32_,auVar148);
        auVar147 = vaddps_avx512vl(auVar147,auVar148);
        auVar129 = vextractf32x4_avx512vl(auVar147,1);
        in_ZMM16 = ZEXT1664(auVar129);
        auVar129 = vaddps_avx512vl(auVar129,auVar147._0_16_);
        auVar138._0_4_ = auVar129._0_4_ + auVar132._0_4_;
        auVar138._4_4_ = auVar129._4_4_ + auVar132._4_4_;
        auVar138._8_4_ = auVar129._8_4_ + auVar132._8_4_;
        auVar138._12_4_ = auVar129._12_4_ + auVar132._12_4_;
        switch(uVar98) {
        case 1:
          auVar138 = vmaxps_avx(auVar138,auVar199);
          break;
        case 2:
          auVar132 = vmaxps_avx(auVar138,auVar199);
          auVar129 = vminps_avx(auVar138,auVar199);
          uVar6 = *(this->super_InnerProduct).activation_params.data;
          auVar31._4_4_ = uVar6;
          auVar31._0_4_ = uVar6;
          auVar31._8_4_ = uVar6;
          auVar31._12_4_ = uVar6;
          auVar138 = vfmadd132ps_avx512vl(auVar129,auVar132,auVar31);
          break;
        case 3:
          puVar10 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar6 = *puVar10;
          auVar29._4_4_ = uVar6;
          auVar29._0_4_ = uVar6;
          auVar29._8_4_ = uVar6;
          auVar29._12_4_ = uVar6;
          auVar132 = vmaxps_avx512vl(auVar138,auVar29);
          uVar6 = puVar10[1];
          auVar30._4_4_ = uVar6;
          auVar30._0_4_ = uVar6;
          auVar30._8_4_ = uVar6;
          auVar30._12_4_ = uVar6;
          auVar138 = vminps_avx512vl(auVar132,auVar30);
          break;
        case 4:
          auVar27._8_4_ = 0x80000000;
          auVar27._0_8_ = 0x8000000080000000;
          auVar27._12_4_ = 0x80000000;
          auVar132 = vxorps_avx512vl(auVar138,auVar27);
          auVar132 = vminps_avx(auVar132,auVar213);
          auVar132 = vmaxps_avx(auVar132,auVar221);
          auVar129 = vfmadd231ps_fma(auVar227,auVar132,auVar232);
          auVar128 = vcvttps2dq_avx512vl(auVar129);
          auVar128 = vcvtdq2ps_avx512vl(auVar128);
          uVar16 = vcmpps_avx512vl(auVar129,auVar128,1);
          auVar129 = vsubps_avx512vl(auVar128,auVar236);
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar139._0_4_ = (uint)bVar14 * auVar129._0_4_ | (uint)!bVar14 * auVar128._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar139._4_4_ = (uint)bVar14 * auVar129._4_4_ | (uint)!bVar14 * auVar128._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar139._8_4_ = (uint)bVar14 * auVar129._8_4_ | (uint)!bVar14 * auVar128._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar139._12_4_ = (uint)bVar14 * auVar129._12_4_ | (uint)!bVar14 * auVar128._12_4_;
          in_ZMM16 = ZEXT1664(auVar139);
          auVar132 = vfmsub231ps_avx512vl(auVar132,auVar139,auVar239);
          auVar28._8_4_ = 0x395e8083;
          auVar28._0_8_ = 0x395e8083395e8083;
          auVar28._12_4_ = 0x395e8083;
          auVar132 = vfmsub231ps_avx512vl(auVar132,auVar139,auVar28);
          auVar242._0_4_ = auVar132._0_4_ * auVar132._0_4_;
          auVar242._4_4_ = auVar132._4_4_ * auVar132._4_4_;
          auVar242._8_4_ = auVar132._8_4_ * auVar132._8_4_;
          auVar242._12_4_ = auVar132._12_4_ * auVar132._12_4_;
          auVar129 = vfmadd213ps_avx512vl(auVar247,auVar132,auVar249);
          auVar129 = vfmadd213ps_avx512vl(auVar129,auVar132,auVar251);
          auVar129 = vfmadd213ps_avx512vl(auVar129,auVar132,auVar253);
          auVar129 = vfmadd213ps_avx512vl(auVar129,auVar132,auVar256);
          auVar129 = vfmadd213ps_avx512vl(auVar129,auVar132,auVar227);
          auVar132 = vfmadd213ps_avx512vl(auVar129,auVar242,auVar132);
          in_ZMM17 = ZEXT1664(auVar132);
          auVar129 = vaddps_avx512vl(auVar132,auVar236);
          auVar132 = vcvttps2dq_avx512vl(auVar139);
          auVar132 = vpslld_avx(auVar132,0x17);
          auVar132 = vpaddd_avx(auVar132,auVar260);
          auVar132 = vfmadd213ps_fma(auVar132,auVar129,auVar236);
          auVar138 = vdivps_avx(auVar236,auVar132);
          break;
        case 5:
          auVar132 = vminps_avx(auVar138,auVar213);
          auVar132 = vmaxps_avx(auVar132,auVar221);
          auVar129 = vfmadd213ps_avx512vl(auVar232,auVar132,auVar227);
          auVar128 = vcvttps2dq_avx512vl(auVar129);
          auVar128 = vcvtdq2ps_avx512vl(auVar128);
          uVar16 = vcmpps_avx512vl(auVar129,auVar128,1);
          auVar129 = vsubps_avx512vl(auVar128,auVar236);
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar133._0_4_ = (uint)bVar14 * auVar129._0_4_ | (uint)!bVar14 * auVar128._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar133._4_4_ = (uint)bVar14 * auVar129._4_4_ | (uint)!bVar14 * auVar128._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar133._8_4_ = (uint)bVar14 * auVar129._8_4_ | (uint)!bVar14 * auVar128._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar133._12_4_ = (uint)bVar14 * auVar129._12_4_ | (uint)!bVar14 * auVar128._12_4_;
          auVar132 = vfmsub231ps_avx512vl(auVar132,auVar133,auVar239);
          auVar132 = vfnmsub231ps_avx512vl(auVar132,auVar133,auVar262);
          auVar129 = vmulps_avx512vl(auVar132,auVar132);
          auVar128 = vfmadd213ps_avx512vl(auVar247,auVar132,auVar249);
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar132,auVar251);
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar132,auVar253);
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar132,auVar256);
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar132,auVar227);
          auVar132 = vfmadd213ps_avx512vl(auVar128,auVar129,auVar132);
          auVar132 = vaddps_avx512vl(auVar132,auVar236);
          auVar129 = vcvttps2dq_avx512vl(auVar133);
          auVar129 = vpslld_avx512vl(auVar129,0x17);
          auVar129 = vpaddd_avx512vl(auVar129,auVar260);
          auVar132 = vfmadd213ps_avx512vl(auVar129,auVar132,auVar236);
          uVar16 = vcmpps_avx512vl(auVar132,auVar199,2);
          auVar20._8_4_ = 0x800000;
          auVar20._0_8_ = 0x80000000800000;
          auVar20._12_4_ = 0x800000;
          auVar132 = vmaxps_avx512vl(auVar132,auVar20);
          auVar129 = vpsrld_avx512vl(auVar132,0x17);
          auVar128 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
          auVar21._8_4_ = 0x3f000000;
          auVar21._0_8_ = 0x3f0000003f000000;
          auVar21._12_4_ = 0x3f000000;
          auVar132 = vpternlogd_avx512vl(auVar132,auVar128,auVar21,0xea);
          auVar22._8_4_ = 0x3f3504f3;
          auVar22._0_8_ = 0x3f3504f33f3504f3;
          auVar22._12_4_ = 0x3f3504f3;
          uVar17 = vcmpps_avx512vl(auVar132,auVar22,1);
          auVar23._8_4_ = 0xbf800000;
          auVar23._0_8_ = 0xbf800000bf800000;
          auVar23._12_4_ = 0xbf800000;
          auVar128 = vaddps_avx512vl(auVar132,auVar23);
          auVar132 = vaddps_avx512vl(auVar128,auVar132);
          bVar14 = (bool)((byte)uVar17 & 1);
          auVar134._0_4_ = (uint)bVar14 * auVar132._0_4_ | (uint)!bVar14 * auVar128._0_4_;
          bVar14 = (bool)((byte)(uVar17 >> 1) & 1);
          auVar134._4_4_ = (uint)bVar14 * auVar132._4_4_ | (uint)!bVar14 * auVar128._4_4_;
          bVar14 = (bool)((byte)(uVar17 >> 2) & 1);
          auVar134._8_4_ = (uint)bVar14 * auVar132._8_4_ | (uint)!bVar14 * auVar128._8_4_;
          bVar14 = (bool)((byte)(uVar17 >> 3) & 1);
          auVar134._12_4_ = (uint)bVar14 * auVar132._12_4_ | (uint)!bVar14 * auVar128._12_4_;
          auVar132 = vmulps_avx512vl(auVar134,auVar134);
          auVar24._8_4_ = 0xbdebd1b8;
          auVar24._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar24._12_4_ = 0xbdebd1b8;
          auVar128 = vfmadd213ps_avx512vl(auVar120,auVar134,auVar24);
          auVar25._8_4_ = 0x3def251a;
          auVar25._0_8_ = 0x3def251a3def251a;
          auVar25._12_4_ = 0x3def251a;
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar134,auVar25);
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar134,auVar122);
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar134,auVar121);
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar134,auVar123);
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar134,auVar124);
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar134,auVar125);
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar134,auVar126);
          auVar130 = vmulps_avx512vl(auVar132,auVar134);
          auVar128 = vmulps_avx512vl(auVar130,auVar128);
          auVar26._8_4_ = 0xffffff82;
          auVar26._0_8_ = 0xffffff82ffffff82;
          auVar26._12_4_ = 0xffffff82;
          auVar129 = vpaddd_avx512vl(auVar129,auVar26);
          auVar129 = vcvtdq2ps_avx512vl(auVar129);
          auVar130 = vsubps_avx512vl(auVar129,auVar236);
          bVar14 = (bool)((byte)uVar17 & 1);
          auVar135._0_4_ = (uint)bVar14 * auVar130._0_4_ | (uint)!bVar14 * auVar129._0_4_;
          bVar14 = (bool)((byte)(uVar17 >> 1) & 1);
          auVar135._4_4_ = (uint)bVar14 * auVar130._4_4_ | (uint)!bVar14 * auVar129._4_4_;
          bVar14 = (bool)((byte)(uVar17 >> 2) & 1);
          auVar135._8_4_ = (uint)bVar14 * auVar130._8_4_ | (uint)!bVar14 * auVar129._8_4_;
          bVar14 = (bool)((byte)(uVar17 >> 3) & 1);
          auVar135._12_4_ = (uint)bVar14 * auVar130._12_4_ | (uint)!bVar14 * auVar129._12_4_;
          auVar129 = vfmadd231ps_avx512vl(auVar128,auVar135,auVar262);
          auVar132 = vfmsub231ps_avx512vl(auVar129,auVar227,auVar132);
          auVar132 = vsubps_avx512vl(auVar132,auVar134);
          auVar132 = vfnmadd231ps_avx512vl(auVar132,auVar239,auVar135);
          auVar129 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar136._0_4_ =
               (uint)bVar14 * auVar129._0_4_ |
               (uint)!bVar14 * (int)(auVar132._0_4_ + auVar132._0_4_);
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar136._4_4_ =
               (uint)bVar14 * auVar129._4_4_ |
               (uint)!bVar14 * (int)(auVar132._4_4_ + auVar132._4_4_);
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar136._8_4_ =
               (uint)bVar14 * auVar129._8_4_ |
               (uint)!bVar14 * (int)(auVar132._8_4_ + auVar132._8_4_);
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar136._12_4_ =
               (uint)bVar14 * auVar129._12_4_ |
               (uint)!bVar14 * (int)(auVar132._12_4_ + auVar132._12_4_);
          auVar132 = vminps_avx(auVar136,auVar213);
          auVar132 = vmaxps_avx(auVar132,auVar221);
          auVar129 = vfmadd213ps_avx512vl(auVar232,auVar132,auVar227);
          auVar128 = vcvttps2dq_avx512vl(auVar129);
          auVar128 = vcvtdq2ps_avx512vl(auVar128);
          uVar16 = vcmpps_avx512vl(auVar129,auVar128,1);
          auVar129 = vsubps_avx512vl(auVar128,auVar236);
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar137._0_4_ = (uint)bVar14 * auVar129._0_4_ | (uint)!bVar14 * auVar128._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar137._4_4_ = (uint)bVar14 * auVar129._4_4_ | (uint)!bVar14 * auVar128._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar137._8_4_ = (uint)bVar14 * auVar129._8_4_ | (uint)!bVar14 * auVar128._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar137._12_4_ = (uint)bVar14 * auVar129._12_4_ | (uint)!bVar14 * auVar128._12_4_;
          in_ZMM17 = ZEXT1664(auVar137);
          auVar132 = vfmsub231ps_avx512vl(auVar132,auVar137,auVar239);
          auVar132 = vfnmsub231ps_avx512vl(auVar132,auVar137,auVar262);
          auVar129 = vmulps_avx512vl(auVar132,auVar132);
          auVar128 = vfmadd213ps_avx512vl(auVar247,auVar132,auVar249);
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar132,auVar251);
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar132,auVar253);
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar132,auVar256);
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar132,auVar227);
          auVar132 = vfmadd213ps_avx512vl(auVar128,auVar129,auVar132);
          in_ZMM18 = ZEXT1664(auVar132);
          auVar132 = vaddps_avx512vl(auVar132,auVar236);
          auVar129 = vcvttps2dq_avx512vl(auVar137);
          auVar129 = vpslld_avx512vl(auVar129,0x17);
          auVar129 = vpaddd_avx512vl(auVar129,auVar260);
          auVar132 = vfmadd213ps_avx512vl(auVar129,auVar132,auVar236);
          in_ZMM16 = ZEXT1664(auVar132);
          auVar132 = vdivps_avx512vl(auVar127,auVar132);
          auVar138 = vfmsub231ps_fma(auVar138,auVar138,auVar132);
          break;
        case 6:
          puVar10 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar6 = *puVar10;
          auVar243._4_4_ = uVar6;
          auVar243._0_4_ = uVar6;
          auVar243._8_4_ = uVar6;
          auVar243._12_4_ = uVar6;
          uVar6 = puVar10[1];
          auVar19._4_4_ = uVar6;
          auVar19._0_4_ = uVar6;
          auVar19._8_4_ = uVar6;
          auVar19._12_4_ = uVar6;
          auVar132 = vfmadd213ps_avx512vl(auVar243,auVar138,auVar19);
          auVar132 = vmaxps_avx(auVar132,auVar199);
          auVar132 = vminps_avx(auVar132,auVar236);
          auVar138._0_4_ = auVar132._0_4_ * auVar138._0_4_;
          auVar138._4_4_ = auVar132._4_4_ * auVar138._4_4_;
          auVar138._8_4_ = auVar132._8_4_ * auVar138._8_4_;
          auVar138._12_4_ = auVar132._12_4_ * auVar138._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar101 * 0x10) = auVar138;
        uVar101 = uVar101 + 1;
      } while (uVar101 != uVar99);
    }
  }
  else {
    if (iVar97 == 8) {
      if (0 < (int)uVar110) {
        uVar101 = 0;
        auVar166._8_4_ = 0x42b0c0a5;
        auVar166._0_8_ = 0x42b0c0a542b0c0a5;
        auVar166._12_4_ = 0x42b0c0a5;
        auVar166._16_4_ = 0x42b0c0a5;
        auVar166._20_4_ = 0x42b0c0a5;
        auVar166._24_4_ = 0x42b0c0a5;
        auVar166._28_4_ = 0x42b0c0a5;
        auVar167._8_4_ = 0xc2b0c0a5;
        auVar167._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar167._12_4_ = 0xc2b0c0a5;
        auVar167._16_4_ = 0xc2b0c0a5;
        auVar167._20_4_ = 0xc2b0c0a5;
        auVar167._24_4_ = 0xc2b0c0a5;
        auVar167._28_4_ = 0xc2b0c0a5;
        auVar168._8_4_ = 0x3f000000;
        auVar168._0_8_ = 0x3f0000003f000000;
        auVar168._12_4_ = 0x3f000000;
        auVar168._16_4_ = 0x3f000000;
        auVar168._20_4_ = 0x3f000000;
        auVar168._24_4_ = 0x3f000000;
        auVar168._28_4_ = 0x3f000000;
        auVar169._8_4_ = 0x3fb8aa3b;
        auVar169._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar169._12_4_ = 0x3fb8aa3b;
        auVar169._16_4_ = 0x3fb8aa3b;
        auVar169._20_4_ = 0x3fb8aa3b;
        auVar169._24_4_ = 0x3fb8aa3b;
        auVar169._28_4_ = 0x3fb8aa3b;
        auVar170._8_4_ = 0x3f800000;
        auVar170._0_8_ = 0x3f8000003f800000;
        auVar170._12_4_ = 0x3f800000;
        auVar170._16_4_ = 0x3f800000;
        auVar170._20_4_ = 0x3f800000;
        auVar170._24_4_ = 0x3f800000;
        auVar170._28_4_ = 0x3f800000;
        auVar171._8_4_ = 0x3f318000;
        auVar171._0_8_ = 0x3f3180003f318000;
        auVar171._12_4_ = 0x3f318000;
        auVar171._16_4_ = 0x3f318000;
        auVar171._20_4_ = 0x3f318000;
        auVar171._24_4_ = 0x3f318000;
        auVar171._28_4_ = 0x3f318000;
        auVar172._8_4_ = 0x39506967;
        auVar172._0_8_ = 0x3950696739506967;
        auVar172._12_4_ = 0x39506967;
        auVar172._16_4_ = 0x39506967;
        auVar172._20_4_ = 0x39506967;
        auVar172._24_4_ = 0x39506967;
        auVar172._28_4_ = 0x39506967;
        auVar178._8_4_ = 0x3ab743ce;
        auVar178._0_8_ = 0x3ab743ce3ab743ce;
        auVar178._12_4_ = 0x3ab743ce;
        auVar178._16_4_ = 0x3ab743ce;
        auVar178._20_4_ = 0x3ab743ce;
        auVar178._24_4_ = 0x3ab743ce;
        auVar178._28_4_ = 0x3ab743ce;
        auVar173._8_4_ = 0x3c088908;
        auVar173._0_8_ = 0x3c0889083c088908;
        auVar173._12_4_ = 0x3c088908;
        auVar173._16_4_ = 0x3c088908;
        auVar173._20_4_ = 0x3c088908;
        auVar173._24_4_ = 0x3c088908;
        auVar173._28_4_ = 0x3c088908;
        auVar174._8_4_ = 0x3d2aa9c1;
        auVar174._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar174._12_4_ = 0x3d2aa9c1;
        auVar174._16_4_ = 0x3d2aa9c1;
        auVar174._20_4_ = 0x3d2aa9c1;
        auVar174._24_4_ = 0x3d2aa9c1;
        auVar174._28_4_ = 0x3d2aa9c1;
        auVar175._8_4_ = 0x3e2aaaaa;
        auVar175._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar175._12_4_ = 0x3e2aaaaa;
        auVar175._16_4_ = 0x3e2aaaaa;
        auVar175._20_4_ = 0x3e2aaaaa;
        auVar175._24_4_ = 0x3e2aaaaa;
        auVar175._28_4_ = 0x3e2aaaaa;
        auVar176._8_4_ = 0x3f800000;
        auVar176._0_8_ = 0x3f8000003f800000;
        auVar176._12_4_ = 0x3f800000;
        auVar176._16_4_ = 0x3f800000;
        auVar176._20_4_ = 0x3f800000;
        auVar176._24_4_ = 0x3f800000;
        auVar176._28_4_ = 0x3f800000;
        auVar177._8_4_ = 0xb95e8083;
        auVar177._0_8_ = 0xb95e8083b95e8083;
        auVar177._12_4_ = 0xb95e8083;
        auVar177._16_4_ = 0xb95e8083;
        auVar177._20_4_ = 0xb95e8083;
        auVar177._24_4_ = 0xb95e8083;
        auVar177._28_4_ = 0xb95e8083;
        auVar147 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar148 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar149 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar150 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar151 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar122 = auVar151._0_16_;
        auVar152 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        do {
          auVar186 = ZEXT1664(ZEXT816(0) << 0x40);
          if (pvVar9 != (void *)0x0) {
            auVar186 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar9 + uVar101 * 0x20));
          }
          pauVar107 = (undefined1 (*) [32])
                      ((long)(this->weight_data_tm).w * uVar101 * (this->weight_data_tm).elemsize +
                      (long)(this->weight_data_tm).data);
          auVar121 = in_ZMM17._0_16_;
          auVar120 = in_ZMM16._0_16_;
          auVar125 = in_ZMM20._0_16_;
          auVar124 = in_ZMM19._0_16_;
          auVar126 = in_ZMM23._0_16_;
          auVar123 = in_ZMM18._0_16_;
          pauVar100 = local_128;
          if ((int)uVar118 < 8) {
            auVar123 = vxorps_avx512vl(auVar123,auVar123);
            auVar154 = ZEXT1632(auVar123);
            auVar123 = vxorps_avx512vl(auVar126,auVar126);
            in_ZMM23 = ZEXT1664(auVar123);
            auVar123 = vxorps_avx512vl(auVar124,auVar124);
            auVar153 = ZEXT1632(auVar123);
            auVar123 = vxorps_avx512vl(auVar125,auVar125);
            in_ZMM20 = ZEXT1664(auVar123);
            auVar120 = vxorps_avx512vl(auVar120,auVar120);
            auVar188 = ZEXT1664(auVar120);
            auVar120 = vxorps_avx512vl(auVar121,auVar121);
            in_ZMM17 = ZEXT1664(auVar120);
            auVar187 = ZEXT864(0);
            uVar113 = 0;
          }
          else {
            auVar187 = ZEXT864(0);
            iVar109 = 7;
            auVar121 = vxorps_avx512vl(auVar121,auVar121);
            in_ZMM17 = ZEXT1664(auVar121);
            auVar120 = vxorps_avx512vl(auVar120,auVar120);
            auVar188 = ZEXT1664(auVar120);
            auVar120 = vxorps_avx512vl(auVar125,auVar125);
            in_ZMM20 = ZEXT1664(auVar120);
            auVar120 = vxorps_avx512vl(auVar124,auVar124);
            auVar190 = ZEXT1664(auVar120);
            auVar120 = vxorps_avx512vl(auVar126,auVar126);
            in_ZMM23 = ZEXT1664(auVar120);
            auVar120 = vxorps_avx512vl(auVar123,auVar123);
            auVar189 = ZEXT1664(auVar120);
            do {
              auVar153 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar100));
              auVar154 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar100 + 4)));
              auVar155 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar100 + 8)));
              auVar156 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar100 + 0xc)));
              auVar153 = vfmadd231ps_avx512vl(auVar186._0_32_,auVar153,*pauVar107);
              auVar186 = ZEXT3264(auVar153);
              auVar153 = vfmadd231ps_avx512vl(auVar187._0_32_,auVar154,pauVar107[1]);
              auVar187 = ZEXT3264(auVar153);
              auVar153 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar155,pauVar107[2]);
              in_ZMM17 = ZEXT3264(auVar153);
              auVar153 = vfmadd231ps_avx512vl(auVar188._0_32_,auVar156,pauVar107[3]);
              auVar188 = ZEXT3264(auVar153);
              auVar153 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar100 + 0x10)));
              auVar154 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar100 + 0x14)));
              auVar155 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar100 + 0x18)));
              auVar156 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar100 + 0x1c)));
              auVar153 = vfmadd231ps_avx512vl(in_ZMM20._0_32_,auVar153,pauVar107[4]);
              in_ZMM20 = ZEXT3264(auVar153);
              auVar153 = vfmadd231ps_avx512vl(auVar190._0_32_,auVar154,pauVar107[5]);
              auVar190 = ZEXT3264(auVar153);
              auVar154 = vfmadd231ps_avx512vl(in_ZMM23._0_32_,auVar155,pauVar107[6]);
              in_ZMM23 = ZEXT3264(auVar154);
              auVar154 = vfmadd231ps_avx512vl(auVar189._0_32_,auVar156,pauVar107[7]);
              auVar189 = ZEXT3264(auVar154);
              pauVar100 = pauVar100 + 1;
              pauVar107 = pauVar107 + 8;
              iVar109 = iVar109 + 8;
              uVar113 = uVar118 & 0xfffffff8;
            } while (iVar109 < (int)uVar118);
          }
          auVar156 = auVar187._0_32_;
          auVar155 = auVar188._0_32_;
          uVar114 = uVar113 | 3;
          while( true ) {
            auVar159 = auVar186._0_32_;
            if ((int)uVar118 <= (int)uVar114) break;
            auVar155 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar100));
            auVar156 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar100 + 4)));
            auVar157 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar100 + 8)));
            auVar158 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar100 + 0xc)));
            auVar155 = vfmadd231ps_avx512vl(auVar159,auVar155,*pauVar107);
            auVar186 = ZEXT3264(auVar155);
            auVar156 = vfmadd231ps_avx512vl(auVar187._0_32_,auVar156,pauVar107[1]);
            auVar187 = ZEXT3264(auVar156);
            auVar155 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar157,pauVar107[2]);
            in_ZMM17 = ZEXT3264(auVar155);
            auVar155 = vfmadd231ps_avx512vl(auVar188._0_32_,auVar158,pauVar107[3]);
            auVar188 = ZEXT3264(auVar155);
            pauVar100 = (undefined1 (*) [32])(*pauVar100 + 0x10);
            pauVar107 = pauVar107 + 4;
            uVar114 = uVar113 + 7;
            uVar113 = uVar113 + 4;
          }
          if (uVar118 - uVar113 != 0 && (int)uVar113 <= (int)uVar118) {
            lVar111 = 0;
            do {
              auVar159 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar100 + lVar111 * 4)));
              auVar159 = vfmadd231ps_avx512vl(auVar186._0_32_,auVar159,*pauVar107);
              auVar186 = ZEXT3264(auVar159);
              pauVar107 = pauVar107 + 1;
              lVar111 = lVar111 + 1;
            } while (uVar118 - uVar113 != (int)lVar111);
          }
          auVar154 = vaddps_avx512vl(in_ZMM23._0_32_,auVar154);
          auVar153 = vaddps_avx512vl(auVar153,in_ZMM20._0_32_);
          in_ZMM19 = ZEXT3264(auVar153);
          auVar153 = vaddps_avx512vl(auVar154,auVar153);
          in_ZMM18 = ZEXT3264(auVar153);
          auVar154 = vaddps_avx512vl(auVar155,in_ZMM17._0_32_);
          in_ZMM16 = ZEXT3264(auVar154);
          auVar154 = vaddps_avx512vl(auVar154,auVar156);
          auVar154 = vaddps_avx512vl(auVar153,auVar154);
          auVar153._0_4_ = auVar154._0_4_ + auVar159._0_4_;
          auVar153._4_4_ = auVar154._4_4_ + auVar159._4_4_;
          auVar153._8_4_ = auVar154._8_4_ + auVar159._8_4_;
          auVar153._12_4_ = auVar154._12_4_ + auVar159._12_4_;
          auVar153._16_4_ = auVar154._16_4_ + auVar159._16_4_;
          auVar153._20_4_ = auVar154._20_4_ + auVar159._20_4_;
          auVar153._24_4_ = auVar154._24_4_ + auVar159._24_4_;
          auVar153._28_4_ = auVar154._28_4_ + auVar159._28_4_;
          if (5 < uVar98 - 1) goto LAB_002ce929;
          auVar154 = ZEXT1632(ZEXT816(0) << 0x40);
          switch(uVar98) {
          case 1:
            auVar153 = vmaxps_avx(auVar153,ZEXT1632(ZEXT816(0) << 0x40));
            break;
          case 2:
            auVar155 = vmaxps_avx(auVar153,auVar154);
            auVar153 = vminps_avx(auVar153,auVar154);
            uVar6 = *(this->super_InnerProduct).activation_params.data;
            auVar60._4_4_ = uVar6;
            auVar60._0_4_ = uVar6;
            auVar60._8_4_ = uVar6;
            auVar60._12_4_ = uVar6;
            auVar60._16_4_ = uVar6;
            auVar60._20_4_ = uVar6;
            auVar60._24_4_ = uVar6;
            auVar60._28_4_ = uVar6;
            auVar153 = vfmadd132ps_avx512vl(auVar153,auVar155,auVar60);
            break;
          case 3:
            puVar10 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar6 = *puVar10;
            auVar58._4_4_ = uVar6;
            auVar58._0_4_ = uVar6;
            auVar58._8_4_ = uVar6;
            auVar58._12_4_ = uVar6;
            auVar58._16_4_ = uVar6;
            auVar58._20_4_ = uVar6;
            auVar58._24_4_ = uVar6;
            auVar58._28_4_ = uVar6;
            auVar153 = vmaxps_avx512vl(auVar153,auVar58);
            uVar6 = puVar10[1];
            auVar59._4_4_ = uVar6;
            auVar59._0_4_ = uVar6;
            auVar59._8_4_ = uVar6;
            auVar59._12_4_ = uVar6;
            auVar59._16_4_ = uVar6;
            auVar59._20_4_ = uVar6;
            auVar59._24_4_ = uVar6;
            auVar59._28_4_ = uVar6;
            auVar153 = vminps_avx512vl(auVar153,auVar59);
            break;
          case 4:
            auVar56._8_4_ = 0x80000000;
            auVar56._0_8_ = 0x8000000080000000;
            auVar56._12_4_ = 0x80000000;
            auVar56._16_4_ = 0x80000000;
            auVar56._20_4_ = 0x80000000;
            auVar56._24_4_ = 0x80000000;
            auVar56._28_4_ = 0x80000000;
            auVar153 = vxorps_avx512vl(auVar153,auVar56);
            auVar153 = vminps_avx(auVar153,auVar166);
            auVar153 = vmaxps_avx(auVar153,auVar167);
            auVar120 = vfmadd231ps_fma(auVar168,auVar153,auVar169);
            auVar154 = vrndscaleps_avx512vl(ZEXT1632(auVar120),1);
            uVar16 = vcmpps_avx512vl(ZEXT1632(auVar120),auVar154,1);
            auVar155 = vsubps_avx512vl(auVar154,auVar170);
            bVar14 = (bool)((byte)uVar16 & 1);
            auVar165._0_4_ = (uint)bVar14 * auVar155._0_4_ | (uint)!bVar14 * auVar154._0_4_;
            bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
            auVar165._4_4_ = (uint)bVar14 * auVar155._4_4_ | (uint)!bVar14 * auVar154._4_4_;
            bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
            auVar165._8_4_ = (uint)bVar14 * auVar155._8_4_ | (uint)!bVar14 * auVar154._8_4_;
            bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
            auVar165._12_4_ = (uint)bVar14 * auVar155._12_4_ | (uint)!bVar14 * auVar154._12_4_;
            bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
            auVar165._16_4_ = (uint)bVar14 * auVar155._16_4_ | (uint)!bVar14 * auVar154._16_4_;
            bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
            auVar165._20_4_ = (uint)bVar14 * auVar155._20_4_ | (uint)!bVar14 * auVar154._20_4_;
            bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
            auVar165._24_4_ = (uint)bVar14 * auVar155._24_4_ | (uint)!bVar14 * auVar154._24_4_;
            bVar14 = SUB81(uVar16 >> 7,0);
            auVar165._28_4_ = (uint)bVar14 * auVar155._28_4_ | (uint)!bVar14 * auVar154._28_4_;
            in_ZMM16 = ZEXT3264(auVar165);
            auVar153 = vfmsub231ps_avx512vl(auVar153,auVar165,auVar171);
            auVar57._8_4_ = 0x395e8083;
            auVar57._0_8_ = 0x395e8083395e8083;
            auVar57._12_4_ = 0x395e8083;
            auVar57._16_4_ = 0x395e8083;
            auVar57._20_4_ = 0x395e8083;
            auVar57._24_4_ = 0x395e8083;
            auVar57._28_4_ = 0x395e8083;
            auVar153 = vfmsub231ps_avx512vl(auVar153,auVar165,auVar57);
            auVar245._0_4_ = auVar153._0_4_ * auVar153._0_4_;
            auVar245._4_4_ = auVar153._4_4_ * auVar153._4_4_;
            auVar245._8_4_ = auVar153._8_4_ * auVar153._8_4_;
            auVar245._12_4_ = auVar153._12_4_ * auVar153._12_4_;
            auVar245._16_4_ = auVar153._16_4_ * auVar153._16_4_;
            auVar245._20_4_ = auVar153._20_4_ * auVar153._20_4_;
            auVar245._24_4_ = auVar153._24_4_ * auVar153._24_4_;
            auVar245._28_4_ = 0;
            auVar154 = vfmadd213ps_avx512vl(auVar172,auVar153,auVar178);
            auVar154 = vfmadd213ps_avx512vl(auVar154,auVar153,auVar173);
            auVar154 = vfmadd213ps_avx512vl(auVar154,auVar153,auVar174);
            auVar154 = vfmadd213ps_avx512vl(auVar154,auVar153,auVar175);
            auVar154 = vfmadd213ps_avx512vl(auVar154,auVar153,auVar168);
            auVar153 = vfmadd213ps_avx512vl(auVar154,auVar245,auVar153);
            in_ZMM17 = ZEXT3264(auVar153);
            auVar154 = vaddps_avx512vl(auVar153,auVar170);
            auVar153 = vcvttps2dq_avx512vl(auVar165);
            auVar153 = vpslld_avx2(auVar153,0x17);
            auVar153 = vpaddd_avx2(auVar153,auVar176);
            auVar120 = vfmadd213ps_fma(auVar153,auVar154,auVar170);
            auVar153 = vdivps_avx(auVar170,ZEXT1632(auVar120));
            break;
          case 5:
            auVar155 = vminps_avx(auVar153,auVar166);
            auVar155 = vmaxps_avx(auVar155,auVar167);
            auVar156 = vfmadd213ps_avx512vl(auVar169,auVar155,auVar168);
            auVar159 = vrndscaleps_avx512vl(auVar156,1);
            uVar16 = vcmpps_avx512vl(auVar156,auVar159,1);
            auVar156 = vsubps_avx512vl(auVar159,auVar170);
            bVar14 = (bool)((byte)uVar16 & 1);
            auVar160._0_4_ = (uint)bVar14 * auVar156._0_4_ | (uint)!bVar14 * auVar159._0_4_;
            bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
            auVar160._4_4_ = (uint)bVar14 * auVar156._4_4_ | (uint)!bVar14 * auVar159._4_4_;
            bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
            auVar160._8_4_ = (uint)bVar14 * auVar156._8_4_ | (uint)!bVar14 * auVar159._8_4_;
            bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
            auVar160._12_4_ = (uint)bVar14 * auVar156._12_4_ | (uint)!bVar14 * auVar159._12_4_;
            bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
            auVar160._16_4_ = (uint)bVar14 * auVar156._16_4_ | (uint)!bVar14 * auVar159._16_4_;
            bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
            auVar160._20_4_ = (uint)bVar14 * auVar156._20_4_ | (uint)!bVar14 * auVar159._20_4_;
            bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
            auVar160._24_4_ = (uint)bVar14 * auVar156._24_4_ | (uint)!bVar14 * auVar159._24_4_;
            bVar14 = SUB81(uVar16 >> 7,0);
            auVar160._28_4_ = (uint)bVar14 * auVar156._28_4_ | (uint)!bVar14 * auVar159._28_4_;
            auVar155 = vfmsub231ps_avx512vl(auVar155,auVar160,auVar171);
            auVar155 = vfnmsub231ps_avx512vl(auVar155,auVar160,auVar177);
            auVar156 = vmulps_avx512vl(auVar155,auVar155);
            auVar159 = vfmadd213ps_avx512vl(auVar172,auVar155,auVar178);
            auVar159 = vfmadd213ps_avx512vl(auVar159,auVar155,auVar173);
            auVar159 = vfmadd213ps_avx512vl(auVar159,auVar155,auVar174);
            auVar159 = vfmadd213ps_avx512vl(auVar159,auVar155,auVar175);
            auVar159 = vfmadd213ps_avx512vl(auVar159,auVar155,auVar168);
            auVar155 = vfmadd213ps_avx512vl(auVar159,auVar156,auVar155);
            auVar155 = vaddps_avx512vl(auVar155,auVar170);
            auVar156 = vcvttps2dq_avx512vl(auVar160);
            auVar156 = vpslld_avx512vl(auVar156,0x17);
            auVar156 = vpaddd_avx512vl(auVar156,auVar176);
            auVar155 = vfmadd213ps_avx512vl(auVar156,auVar155,auVar170);
            uVar16 = vcmpps_avx512vl(auVar155,auVar154,2);
            auVar154._8_4_ = 0x800000;
            auVar154._0_8_ = 0x80000000800000;
            auVar154._12_4_ = 0x800000;
            auVar154._16_4_ = 0x800000;
            auVar154._20_4_ = 0x800000;
            auVar154._24_4_ = 0x800000;
            auVar154._28_4_ = 0x800000;
            auVar154 = vmaxps_avx512vl(auVar155,auVar154);
            auVar155 = vpsrld_avx512vl(auVar154,0x17);
            auVar156 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
            auVar159._8_4_ = 0x3f000000;
            auVar159._0_8_ = 0x3f0000003f000000;
            auVar159._12_4_ = 0x3f000000;
            auVar159._16_4_ = 0x3f000000;
            auVar159._20_4_ = 0x3f000000;
            auVar159._24_4_ = 0x3f000000;
            auVar159._28_4_ = 0x3f000000;
            auVar154 = vpternlogd_avx512vl(auVar154,auVar156,auVar159,0xea);
            auVar157._8_4_ = 0x3f3504f3;
            auVar157._0_8_ = 0x3f3504f33f3504f3;
            auVar157._12_4_ = 0x3f3504f3;
            auVar157._16_4_ = 0x3f3504f3;
            auVar157._20_4_ = 0x3f3504f3;
            auVar157._24_4_ = 0x3f3504f3;
            auVar157._28_4_ = 0x3f3504f3;
            uVar17 = vcmpps_avx512vl(auVar154,auVar157,1);
            auVar156 = vaddps_avx512vl(auVar154,auVar147);
            auVar154 = vaddps_avx512vl(auVar156,auVar154);
            bVar14 = (bool)((byte)uVar17 & 1);
            auVar161._0_4_ = (uint)bVar14 * auVar154._0_4_ | (uint)!bVar14 * auVar156._0_4_;
            bVar14 = (bool)((byte)(uVar17 >> 1) & 1);
            auVar161._4_4_ = (uint)bVar14 * auVar154._4_4_ | (uint)!bVar14 * auVar156._4_4_;
            bVar14 = (bool)((byte)(uVar17 >> 2) & 1);
            auVar161._8_4_ = (uint)bVar14 * auVar154._8_4_ | (uint)!bVar14 * auVar156._8_4_;
            bVar14 = (bool)((byte)(uVar17 >> 3) & 1);
            auVar161._12_4_ = (uint)bVar14 * auVar154._12_4_ | (uint)!bVar14 * auVar156._12_4_;
            bVar14 = (bool)((byte)(uVar17 >> 4) & 1);
            auVar161._16_4_ = (uint)bVar14 * auVar154._16_4_ | (uint)!bVar14 * auVar156._16_4_;
            bVar14 = (bool)((byte)(uVar17 >> 5) & 1);
            auVar161._20_4_ = (uint)bVar14 * auVar154._20_4_ | (uint)!bVar14 * auVar156._20_4_;
            bVar14 = (bool)((byte)(uVar17 >> 6) & 1);
            auVar161._24_4_ = (uint)bVar14 * auVar154._24_4_ | (uint)!bVar14 * auVar156._24_4_;
            bVar14 = SUB81(uVar17 >> 7,0);
            auVar161._28_4_ = (uint)bVar14 * auVar154._28_4_ | (uint)!bVar14 * auVar156._28_4_;
            auVar154 = vmulps_avx512vl(auVar161,auVar161);
            auVar156 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
            auVar158._8_4_ = 0xbdebd1b8;
            auVar158._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar158._12_4_ = 0xbdebd1b8;
            auVar158._16_4_ = 0xbdebd1b8;
            auVar158._20_4_ = 0xbdebd1b8;
            auVar158._24_4_ = 0xbdebd1b8;
            auVar158._28_4_ = 0xbdebd1b8;
            auVar156 = vfmadd213ps_avx512vl(auVar156,auVar161,auVar158);
            auVar52._8_4_ = 0x3def251a;
            auVar52._0_8_ = 0x3def251a3def251a;
            auVar52._12_4_ = 0x3def251a;
            auVar52._16_4_ = 0x3def251a;
            auVar52._20_4_ = 0x3def251a;
            auVar52._24_4_ = 0x3def251a;
            auVar52._28_4_ = 0x3def251a;
            auVar156 = vfmadd213ps_avx512vl(auVar156,auVar161,auVar52);
            auVar53._8_4_ = 0xbdfe5d4f;
            auVar53._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar53._12_4_ = 0xbdfe5d4f;
            auVar53._16_4_ = 0xbdfe5d4f;
            auVar53._20_4_ = 0xbdfe5d4f;
            auVar53._24_4_ = 0xbdfe5d4f;
            auVar53._28_4_ = 0xbdfe5d4f;
            auVar156 = vfmadd213ps_avx512vl(auVar156,auVar161,auVar53);
            auVar54._8_4_ = 0x3e11e9bf;
            auVar54._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar54._12_4_ = 0x3e11e9bf;
            auVar54._16_4_ = 0x3e11e9bf;
            auVar54._20_4_ = 0x3e11e9bf;
            auVar54._24_4_ = 0x3e11e9bf;
            auVar54._28_4_ = 0x3e11e9bf;
            auVar156 = vfmadd213ps_avx512vl(auVar156,auVar161,auVar54);
            auVar156 = vfmadd213ps_avx512vl(auVar156,auVar161,auVar148);
            auVar156 = vfmadd213ps_avx512vl(auVar156,auVar161,auVar149);
            auVar156 = vfmadd213ps_avx512vl(auVar156,auVar161,auVar150);
            auVar156 = vfmadd213ps_avx512vl(auVar156,auVar161,auVar151);
            auVar159 = vmulps_avx512vl(auVar154,auVar161);
            in_ZMM19 = ZEXT3264(auVar159);
            auVar156 = vmulps_avx512vl(auVar159,auVar156);
            auVar55._8_4_ = 0xffffff82;
            auVar55._0_8_ = 0xffffff82ffffff82;
            auVar55._12_4_ = 0xffffff82;
            auVar55._16_4_ = 0xffffff82;
            auVar55._20_4_ = 0xffffff82;
            auVar55._24_4_ = 0xffffff82;
            auVar55._28_4_ = 0xffffff82;
            auVar155 = vpaddd_avx512vl(auVar155,auVar55);
            auVar155 = vcvtdq2ps_avx512vl(auVar155);
            auVar159 = vsubps_avx512vl(auVar155,auVar170);
            bVar14 = (bool)((byte)uVar17 & 1);
            auVar162._0_4_ = (uint)bVar14 * auVar159._0_4_ | (uint)!bVar14 * auVar155._0_4_;
            bVar14 = (bool)((byte)(uVar17 >> 1) & 1);
            auVar162._4_4_ = (uint)bVar14 * auVar159._4_4_ | (uint)!bVar14 * auVar155._4_4_;
            bVar14 = (bool)((byte)(uVar17 >> 2) & 1);
            auVar162._8_4_ = (uint)bVar14 * auVar159._8_4_ | (uint)!bVar14 * auVar155._8_4_;
            bVar14 = (bool)((byte)(uVar17 >> 3) & 1);
            auVar162._12_4_ = (uint)bVar14 * auVar159._12_4_ | (uint)!bVar14 * auVar155._12_4_;
            bVar14 = (bool)((byte)(uVar17 >> 4) & 1);
            auVar162._16_4_ = (uint)bVar14 * auVar159._16_4_ | (uint)!bVar14 * auVar155._16_4_;
            bVar14 = (bool)((byte)(uVar17 >> 5) & 1);
            auVar162._20_4_ = (uint)bVar14 * auVar159._20_4_ | (uint)!bVar14 * auVar155._20_4_;
            bVar14 = (bool)((byte)(uVar17 >> 6) & 1);
            auVar162._24_4_ = (uint)bVar14 * auVar159._24_4_ | (uint)!bVar14 * auVar155._24_4_;
            bVar14 = SUB81(uVar17 >> 7,0);
            auVar162._28_4_ = (uint)bVar14 * auVar159._28_4_ | (uint)!bVar14 * auVar155._28_4_;
            auVar155 = vfmadd231ps_avx512vl(auVar156,auVar162,auVar177);
            auVar154 = vfmsub231ps_avx512vl(auVar155,auVar168,auVar154);
            auVar154 = vsubps_avx512vl(auVar154,auVar161);
            auVar154 = vfmsub231ps_avx512vl(auVar154,auVar171,auVar162);
            auVar154 = vmulps_avx512vl(auVar154,auVar152);
            auVar155 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar14 = (bool)((byte)uVar16 & 1);
            auVar163._0_4_ = (uint)bVar14 * auVar155._0_4_ | (uint)!bVar14 * auVar154._0_4_;
            bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
            auVar163._4_4_ = (uint)bVar14 * auVar155._4_4_ | (uint)!bVar14 * auVar154._4_4_;
            bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
            auVar163._8_4_ = (uint)bVar14 * auVar155._8_4_ | (uint)!bVar14 * auVar154._8_4_;
            bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
            auVar163._12_4_ = (uint)bVar14 * auVar155._12_4_ | (uint)!bVar14 * auVar154._12_4_;
            bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
            auVar163._16_4_ = (uint)bVar14 * auVar155._16_4_ | (uint)!bVar14 * auVar154._16_4_;
            bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
            auVar163._20_4_ = (uint)bVar14 * auVar155._20_4_ | (uint)!bVar14 * auVar154._20_4_;
            bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
            auVar163._24_4_ = (uint)bVar14 * auVar155._24_4_ | (uint)!bVar14 * auVar154._24_4_;
            bVar14 = SUB81(uVar16 >> 7,0);
            auVar163._28_4_ = (uint)bVar14 * auVar155._28_4_ | (uint)!bVar14 * auVar154._28_4_;
            auVar154 = vminps_avx(auVar163,auVar166);
            auVar154 = vmaxps_avx(auVar154,auVar167);
            auVar155 = vfmadd213ps_avx512vl(auVar169,auVar154,auVar168);
            auVar156 = vrndscaleps_avx512vl(auVar155,1);
            uVar16 = vcmpps_avx512vl(auVar155,auVar156,1);
            auVar155 = vsubps_avx512vl(auVar156,auVar170);
            bVar14 = (bool)((byte)uVar16 & 1);
            auVar164._0_4_ = (uint)bVar14 * auVar155._0_4_ | (uint)!bVar14 * auVar156._0_4_;
            bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
            auVar164._4_4_ = (uint)bVar14 * auVar155._4_4_ | (uint)!bVar14 * auVar156._4_4_;
            bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
            auVar164._8_4_ = (uint)bVar14 * auVar155._8_4_ | (uint)!bVar14 * auVar156._8_4_;
            bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
            auVar164._12_4_ = (uint)bVar14 * auVar155._12_4_ | (uint)!bVar14 * auVar156._12_4_;
            bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
            auVar164._16_4_ = (uint)bVar14 * auVar155._16_4_ | (uint)!bVar14 * auVar156._16_4_;
            bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
            auVar164._20_4_ = (uint)bVar14 * auVar155._20_4_ | (uint)!bVar14 * auVar156._20_4_;
            bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
            auVar164._24_4_ = (uint)bVar14 * auVar155._24_4_ | (uint)!bVar14 * auVar156._24_4_;
            bVar14 = SUB81(uVar16 >> 7,0);
            auVar164._28_4_ = (uint)bVar14 * auVar155._28_4_ | (uint)!bVar14 * auVar156._28_4_;
            in_ZMM17 = ZEXT3264(auVar164);
            auVar154 = vfmsub231ps_avx512vl(auVar154,auVar164,auVar171);
            auVar154 = vfnmsub231ps_avx512vl(auVar154,auVar164,auVar177);
            auVar155 = vmulps_avx512vl(auVar154,auVar154);
            auVar156 = vfmadd213ps_avx512vl(auVar172,auVar154,auVar178);
            auVar156 = vfmadd213ps_avx512vl(auVar156,auVar154,auVar173);
            auVar156 = vfmadd213ps_avx512vl(auVar156,auVar154,auVar174);
            auVar156 = vfmadd213ps_avx512vl(auVar156,auVar154,auVar175);
            auVar156 = vfmadd213ps_avx512vl(auVar156,auVar154,auVar168);
            auVar154 = vfmadd213ps_avx512vl(auVar156,auVar155,auVar154);
            in_ZMM18 = ZEXT3264(auVar154);
            auVar154 = vaddps_avx512vl(auVar154,auVar170);
            auVar155 = vcvttps2dq_avx512vl(auVar164);
            auVar155 = vpslld_avx512vl(auVar155,0x17);
            auVar155 = vpaddd_avx512vl(auVar155,auVar176);
            auVar154 = vfmadd213ps_avx512vl(auVar155,auVar154,auVar170);
            in_ZMM16 = ZEXT3264(auVar154);
            auVar154 = vdivps_avx512vl(auVar170,auVar154);
            auVar154 = vfnmadd213ps_avx512vl(auVar154,auVar152,auVar147);
            auVar146 = auVar154._0_28_;
            goto LAB_002ce925;
          case 6:
            puVar10 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar6 = *puVar10;
            auVar156._4_4_ = uVar6;
            auVar156._0_4_ = uVar6;
            auVar156._8_4_ = uVar6;
            auVar156._12_4_ = uVar6;
            auVar156._16_4_ = uVar6;
            auVar156._20_4_ = uVar6;
            auVar156._24_4_ = uVar6;
            auVar156._28_4_ = uVar6;
            uVar6 = puVar10[1];
            auVar155._4_4_ = uVar6;
            auVar155._0_4_ = uVar6;
            auVar155._8_4_ = uVar6;
            auVar155._12_4_ = uVar6;
            auVar155._16_4_ = uVar6;
            auVar155._20_4_ = uVar6;
            auVar155._24_4_ = uVar6;
            auVar155._28_4_ = uVar6;
            auVar155 = vfmadd213ps_avx512vl(auVar156,auVar153,auVar155);
            auVar154 = vmaxps_avx(auVar155,auVar154);
            auVar154 = vminps_avx(auVar154,auVar170);
            auVar146 = auVar154._0_28_;
LAB_002ce925:
            auVar153._4_4_ = auVar146._4_4_ * auVar153._4_4_;
            auVar153._0_4_ = auVar146._0_4_ * auVar153._0_4_;
            auVar153._8_4_ = auVar146._8_4_ * auVar153._8_4_;
            auVar153._12_4_ = auVar146._12_4_ * auVar153._12_4_;
            auVar153._16_4_ = auVar146._16_4_ * auVar153._16_4_;
            auVar153._20_4_ = auVar146._20_4_ * auVar153._20_4_;
            auVar153._24_4_ = auVar146._24_4_ * auVar153._24_4_;
          }
LAB_002ce929:
          *(undefined1 (*) [32])((long)top_blob->data + uVar101 * 0x20) = auVar153;
          uVar101 = uVar101 + 1;
        } while (uVar101 != uVar99);
      }
      goto LAB_002ce948;
    }
    if ((iVar97 == 0x10) && (0 < (int)uVar110)) {
      auVar186 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar187 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q2,auVar186);
      auVar188 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar186);
      auVar189 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar190 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar186);
      uVar101 = 0;
      auVar120 = vxorps_avx512vl(auVar120,auVar120);
      auVar269 = ZEXT1664(auVar120);
      auVar191 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar192 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      do {
        auVar120 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        auVar264 = ZEXT1664(auVar120);
        if (pvVar9 != (void *)0x0) {
          auVar264 = *(undefined1 (*) [64])((long)pvVar9 + uVar101 * 0x40);
        }
        pauVar106 = (undefined1 (*) [64])
                    ((long)(this->weight_data_tm).w * uVar101 * (this->weight_data_tm).elemsize +
                    (long)(this->weight_data_tm).data);
        auVar122 = in_ZMM18._0_16_;
        auVar126 = in_ZMM23._0_16_;
        auVar124 = in_ZMM21._0_16_;
        auVar125 = in_ZMM22._0_16_;
        auVar121 = in_ZMM19._0_16_;
        auVar123 = in_ZMM20._0_16_;
        auVar120 = in_ZMM17._0_16_;
        pauVar108 = local_128;
        if ((int)uVar118 < 8) {
          auVar122 = vxorps_avx512vl(auVar122,auVar122);
          auVar266 = ZEXT1664(auVar122);
          auVar122 = vxorps_avx512vl(auVar126,auVar126);
          in_ZMM23 = ZEXT1664(auVar122);
          auVar122 = vxorps_avx512vl(auVar124,auVar124);
          auVar268 = ZEXT1664(auVar122);
          auVar122 = vxorps_avx512vl(auVar125,auVar125);
          in_ZMM22 = ZEXT1664(auVar122);
          auVar122 = vxorps_avx512vl(auVar121,auVar121);
          auVar267 = ZEXT1664(auVar122);
          auVar122 = vxorps_avx512vl(auVar123,auVar123);
          in_ZMM20 = ZEXT1664(auVar122);
          auVar120 = vxorps_avx512vl(auVar120,auVar120);
          auVar265 = ZEXT1664(auVar120);
          uVar110 = 0;
        }
        else {
          auVar120 = vxorps_avx512vl(auVar120,auVar120);
          auVar265 = ZEXT1664(auVar120);
          iVar97 = 7;
          auVar120 = vxorps_avx512vl(auVar123,auVar123);
          in_ZMM20 = ZEXT1664(auVar120);
          auVar120 = vxorps_avx512vl(auVar121,auVar121);
          auVar267 = ZEXT1664(auVar120);
          auVar120 = vxorps_avx512vl(auVar125,auVar125);
          in_ZMM22 = ZEXT1664(auVar120);
          auVar120 = vxorps_avx512vl(auVar124,auVar124);
          auVar268 = ZEXT1664(auVar120);
          auVar120 = vxorps_avx512vl(auVar126,auVar126);
          in_ZMM23 = ZEXT1664(auVar120);
          auVar120 = vxorps_avx512vl(auVar122,auVar122);
          auVar266 = ZEXT1664(auVar120);
          do {
            auVar193 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar108));
            auVar194 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar108 + 4)));
            auVar195 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar108 + 8)));
            auVar196 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar108 + 0xc)));
            auVar264 = vfmadd231ps_avx512f(auVar264,auVar193,*pauVar106);
            auVar265 = vfmadd231ps_avx512f(auVar265,auVar194,pauVar106[1]);
            in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar195,pauVar106[2]);
            auVar267 = vfmadd231ps_avx512f(auVar267,auVar196,pauVar106[3]);
            auVar193 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar108 + 0x10)));
            auVar194 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar108 + 0x14)));
            auVar195 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar108 + 0x18)));
            auVar196 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar108 + 0x1c)));
            in_ZMM22 = vfmadd231ps_avx512f(in_ZMM22,auVar193,pauVar106[4]);
            auVar268 = vfmadd231ps_avx512f(auVar268,auVar194,pauVar106[5]);
            in_ZMM23 = vfmadd231ps_avx512f(in_ZMM23,auVar195,pauVar106[6]);
            auVar266 = vfmadd231ps_avx512f(auVar266,auVar196,pauVar106[7]);
            pauVar108 = pauVar108 + 1;
            pauVar106 = pauVar106 + 8;
            iVar97 = iVar97 + 8;
            uVar110 = uVar118 & 0xfffffff8;
          } while (iVar97 < (int)uVar118);
        }
        uVar113 = uVar110 | 3;
        while ((int)uVar113 < (int)uVar118) {
          auVar193 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar108));
          auVar194 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar108 + 4)));
          auVar195 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar108 + 8)));
          auVar196 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar108 + 0xc)));
          auVar264 = vfmadd231ps_avx512f(auVar264,auVar193,*pauVar106);
          auVar265 = vfmadd231ps_avx512f(auVar265,auVar194,pauVar106[1]);
          in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar195,pauVar106[2]);
          auVar267 = vfmadd231ps_avx512f(auVar267,auVar196,pauVar106[3]);
          pauVar108 = (undefined1 (*) [32])(*pauVar108 + 0x10);
          pauVar106 = pauVar106 + 4;
          uVar113 = uVar110 + 7;
          uVar110 = uVar110 + 4;
        }
        if (uVar118 - uVar110 != 0 && (int)uVar110 <= (int)uVar118) {
          lVar111 = 0;
          do {
            auVar193 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar108 + lVar111 * 4)));
            auVar264 = vfmadd231ps_avx512f(auVar264,auVar193,*pauVar106);
            pauVar106 = pauVar106 + 1;
            lVar111 = lVar111 + 1;
          } while (uVar118 - uVar110 != (int)lVar111);
        }
        auVar266 = vaddps_avx512f(in_ZMM23,auVar266);
        in_ZMM21 = vaddps_avx512f(auVar268,in_ZMM22);
        in_ZMM18 = vaddps_avx512f(auVar266,in_ZMM21);
        in_ZMM19 = vaddps_avx512f(auVar267,in_ZMM20);
        auVar265 = vaddps_avx512f(in_ZMM19,auVar265);
        in_ZMM17 = vaddps_avx512f(in_ZMM18,auVar265);
        auVar264 = vaddps_avx512f(in_ZMM17,auVar264);
        in_ZMM16 = auVar264;
        switch(uVar98) {
        case 1:
          in_ZMM16 = vmaxps_avx512f(auVar264,auVar269);
          break;
        case 2:
          uVar16 = vcmpps_avx512f(auVar264,auVar269,1);
          uVar6 = *(this->super_InnerProduct).activation_params.data;
          auVar195._4_4_ = uVar6;
          auVar195._0_4_ = uVar6;
          auVar195._8_4_ = uVar6;
          auVar195._12_4_ = uVar6;
          auVar195._16_4_ = uVar6;
          auVar195._20_4_ = uVar6;
          auVar195._24_4_ = uVar6;
          auVar195._28_4_ = uVar6;
          auVar195._32_4_ = uVar6;
          auVar195._36_4_ = uVar6;
          auVar195._40_4_ = uVar6;
          auVar195._44_4_ = uVar6;
          auVar195._48_4_ = uVar6;
          auVar195._52_4_ = uVar6;
          auVar195._56_4_ = uVar6;
          auVar195._60_4_ = uVar6;
          auVar265 = vmulps_avx512f(auVar264,auVar195);
          bVar14 = (bool)((byte)uVar16 & 1);
          in_ZMM16._0_4_ = (uint)bVar14 * auVar265._0_4_ | (uint)!bVar14 * auVar264._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          in_ZMM16._4_4_ = (uint)bVar14 * auVar265._4_4_ | (uint)!bVar14 * auVar264._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          in_ZMM16._8_4_ = (uint)bVar14 * auVar265._8_4_ | (uint)!bVar14 * auVar264._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          in_ZMM16._12_4_ = (uint)bVar14 * auVar265._12_4_ | (uint)!bVar14 * auVar264._12_4_;
          bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
          in_ZMM16._16_4_ = (uint)bVar14 * auVar265._16_4_ | (uint)!bVar14 * auVar264._16_4_;
          bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
          in_ZMM16._20_4_ = (uint)bVar14 * auVar265._20_4_ | (uint)!bVar14 * auVar264._20_4_;
          bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
          in_ZMM16._24_4_ = (uint)bVar14 * auVar265._24_4_ | (uint)!bVar14 * auVar264._24_4_;
          bVar14 = (bool)((byte)(uVar16 >> 7) & 1);
          in_ZMM16._28_4_ = (uint)bVar14 * auVar265._28_4_ | (uint)!bVar14 * auVar264._28_4_;
          bVar14 = (bool)((byte)(uVar16 >> 8) & 1);
          in_ZMM16._32_4_ = (uint)bVar14 * auVar265._32_4_ | (uint)!bVar14 * auVar264._32_4_;
          bVar14 = (bool)((byte)(uVar16 >> 9) & 1);
          in_ZMM16._36_4_ = (uint)bVar14 * auVar265._36_4_ | (uint)!bVar14 * auVar264._36_4_;
          bVar14 = (bool)((byte)(uVar16 >> 10) & 1);
          in_ZMM16._40_4_ = (uint)bVar14 * auVar265._40_4_ | (uint)!bVar14 * auVar264._40_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xb) & 1);
          in_ZMM16._44_4_ = (uint)bVar14 * auVar265._44_4_ | (uint)!bVar14 * auVar264._44_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xc) & 1);
          in_ZMM16._48_4_ = (uint)bVar14 * auVar265._48_4_ | (uint)!bVar14 * auVar264._48_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xd) & 1);
          in_ZMM16._52_4_ = (uint)bVar14 * auVar265._52_4_ | (uint)!bVar14 * auVar264._52_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xe) & 1);
          in_ZMM16._56_4_ = (uint)bVar14 * auVar265._56_4_ | (uint)!bVar14 * auVar264._56_4_;
          bVar14 = SUB81(uVar16 >> 0xf,0);
          in_ZMM16._60_4_ = (uint)bVar14 * auVar265._60_4_ | (uint)!bVar14 * auVar264._60_4_;
          break;
        case 3:
          puVar10 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar6 = *puVar10;
          auVar194._4_4_ = uVar6;
          auVar194._0_4_ = uVar6;
          auVar194._8_4_ = uVar6;
          auVar194._12_4_ = uVar6;
          auVar194._16_4_ = uVar6;
          auVar194._20_4_ = uVar6;
          auVar194._24_4_ = uVar6;
          auVar194._28_4_ = uVar6;
          auVar194._32_4_ = uVar6;
          auVar194._36_4_ = uVar6;
          auVar194._40_4_ = uVar6;
          auVar194._44_4_ = uVar6;
          auVar194._48_4_ = uVar6;
          auVar194._52_4_ = uVar6;
          auVar194._56_4_ = uVar6;
          auVar194._60_4_ = uVar6;
          auVar265 = vmaxps_avx512f(auVar264,auVar194);
          uVar6 = puVar10[1];
          auVar264._4_4_ = uVar6;
          auVar264._0_4_ = uVar6;
          auVar264._8_4_ = uVar6;
          auVar264._12_4_ = uVar6;
          auVar264._16_4_ = uVar6;
          auVar264._20_4_ = uVar6;
          auVar264._24_4_ = uVar6;
          auVar264._28_4_ = uVar6;
          auVar264._32_4_ = uVar6;
          auVar264._36_4_ = uVar6;
          auVar264._40_4_ = uVar6;
          auVar264._44_4_ = uVar6;
          auVar264._48_4_ = uVar6;
          auVar264._52_4_ = uVar6;
          auVar264._56_4_ = uVar6;
          auVar264._60_4_ = uVar6;
          in_ZMM16 = vminps_avx512f(auVar265,auVar264);
          break;
        case 4:
          auVar264 = vxorps_avx512dq(auVar264,auVar186);
          auVar264 = vminps_avx512f(auVar264,(undefined1  [64])afVar86);
          auVar264 = vmaxps_avx512f(auVar264,(undefined1  [64])afVar87);
          auVar265 = vfmadd213ps_avx512f((undefined1  [64])afVar88,auVar264,
                                         (undefined1  [64])afVar94);
          auVar267 = vrndscaleps_avx512f(auVar265,1);
          uVar16 = vcmpps_avx512f(auVar265,auVar267,1);
          auVar265 = vsubps_avx512f(auVar267,(undefined1  [64])afVar85);
          bVar14 = (bool)((byte)uVar16 & 1);
          in_ZMM18._0_4_ = (uint)bVar14 * auVar265._0_4_ | (uint)!bVar14 * auVar267._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          in_ZMM18._4_4_ = (uint)bVar14 * auVar265._4_4_ | (uint)!bVar14 * auVar267._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          in_ZMM18._8_4_ = (uint)bVar14 * auVar265._8_4_ | (uint)!bVar14 * auVar267._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          in_ZMM18._12_4_ = (uint)bVar14 * auVar265._12_4_ | (uint)!bVar14 * auVar267._12_4_;
          bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
          in_ZMM18._16_4_ = (uint)bVar14 * auVar265._16_4_ | (uint)!bVar14 * auVar267._16_4_;
          bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
          in_ZMM18._20_4_ = (uint)bVar14 * auVar265._20_4_ | (uint)!bVar14 * auVar267._20_4_;
          bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
          in_ZMM18._24_4_ = (uint)bVar14 * auVar265._24_4_ | (uint)!bVar14 * auVar267._24_4_;
          bVar14 = (bool)((byte)(uVar16 >> 7) & 1);
          in_ZMM18._28_4_ = (uint)bVar14 * auVar265._28_4_ | (uint)!bVar14 * auVar267._28_4_;
          bVar14 = (bool)((byte)(uVar16 >> 8) & 1);
          in_ZMM18._32_4_ = (uint)bVar14 * auVar265._32_4_ | (uint)!bVar14 * auVar267._32_4_;
          bVar14 = (bool)((byte)(uVar16 >> 9) & 1);
          in_ZMM18._36_4_ = (uint)bVar14 * auVar265._36_4_ | (uint)!bVar14 * auVar267._36_4_;
          bVar14 = (bool)((byte)(uVar16 >> 10) & 1);
          in_ZMM18._40_4_ = (uint)bVar14 * auVar265._40_4_ | (uint)!bVar14 * auVar267._40_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xb) & 1);
          in_ZMM18._44_4_ = (uint)bVar14 * auVar265._44_4_ | (uint)!bVar14 * auVar267._44_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xc) & 1);
          in_ZMM18._48_4_ = (uint)bVar14 * auVar265._48_4_ | (uint)!bVar14 * auVar267._48_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xd) & 1);
          in_ZMM18._52_4_ = (uint)bVar14 * auVar265._52_4_ | (uint)!bVar14 * auVar267._52_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xe) & 1);
          in_ZMM18._56_4_ = (uint)bVar14 * auVar265._56_4_ | (uint)!bVar14 * auVar267._56_4_;
          bVar14 = SUB81(uVar16 >> 0xf,0);
          in_ZMM18._60_4_ = (uint)bVar14 * auVar265._60_4_ | (uint)!bVar14 * auVar267._60_4_;
          auVar264 = vfmadd231ps_avx512f(auVar264,in_ZMM18,auVar187);
          auVar264 = vfmadd231ps_avx512f(auVar264,in_ZMM18,auVar188);
          auVar265 = vmulps_avx512f(auVar264,auVar264);
          auVar267 = vfmadd213ps_avx512f(auVar264,(undefined1  [64])afVar89,
                                         (undefined1  [64])afVar90);
          auVar267 = vfmadd213ps_avx512f(auVar267,auVar264,(undefined1  [64])afVar91);
          auVar267 = vfmadd213ps_avx512f(auVar267,auVar264,(undefined1  [64])afVar92);
          auVar267 = vfmadd213ps_avx512f(auVar267,auVar264,(undefined1  [64])afVar93);
          auVar267 = vfmadd213ps_avx512f(auVar267,auVar264,(undefined1  [64])afVar94);
          in_ZMM19 = vfmadd213ps_avx512f(auVar267,auVar265,auVar264);
          auVar264 = vaddps_avx512f(in_ZMM19,(undefined1  [64])afVar85);
          auVar265 = vcvttps2dq_avx512f(in_ZMM18);
          auVar265 = vpaddd_avx512f(auVar265,auVar189);
          auVar265 = vpslld_avx512f(auVar265,0x17);
          in_ZMM17 = vfmadd213ps_avx512f(auVar265,auVar264,auVar191);
          in_ZMM16 = vdivps_avx512f(auVar191,in_ZMM17);
          break;
        case 5:
          auVar265 = vminps_avx512f(auVar264,(undefined1  [64])afVar86);
          auVar265 = vmaxps_avx512f(auVar265,(undefined1  [64])afVar87);
          auVar267 = vfmadd213ps_avx512f((undefined1  [64])afVar88,auVar265,
                                         (undefined1  [64])afVar94);
          auVar268 = vrndscaleps_avx512f(auVar267,1);
          uVar16 = vcmpps_avx512f(auVar267,auVar268,1);
          auVar267 = vsubps_avx512f(auVar268,(undefined1  [64])afVar85);
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar266._0_4_ = (uint)bVar14 * auVar267._0_4_ | (uint)!bVar14 * auVar268._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar266._4_4_ = (uint)bVar14 * auVar267._4_4_ | (uint)!bVar14 * auVar268._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar266._8_4_ = (uint)bVar14 * auVar267._8_4_ | (uint)!bVar14 * auVar268._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar266._12_4_ = (uint)bVar14 * auVar267._12_4_ | (uint)!bVar14 * auVar268._12_4_;
          bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
          auVar266._16_4_ = (uint)bVar14 * auVar267._16_4_ | (uint)!bVar14 * auVar268._16_4_;
          bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
          auVar266._20_4_ = (uint)bVar14 * auVar267._20_4_ | (uint)!bVar14 * auVar268._20_4_;
          bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
          auVar266._24_4_ = (uint)bVar14 * auVar267._24_4_ | (uint)!bVar14 * auVar268._24_4_;
          bVar14 = (bool)((byte)(uVar16 >> 7) & 1);
          auVar266._28_4_ = (uint)bVar14 * auVar267._28_4_ | (uint)!bVar14 * auVar268._28_4_;
          bVar14 = (bool)((byte)(uVar16 >> 8) & 1);
          auVar266._32_4_ = (uint)bVar14 * auVar267._32_4_ | (uint)!bVar14 * auVar268._32_4_;
          bVar14 = (bool)((byte)(uVar16 >> 9) & 1);
          auVar266._36_4_ = (uint)bVar14 * auVar267._36_4_ | (uint)!bVar14 * auVar268._36_4_;
          bVar14 = (bool)((byte)(uVar16 >> 10) & 1);
          auVar266._40_4_ = (uint)bVar14 * auVar267._40_4_ | (uint)!bVar14 * auVar268._40_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xb) & 1);
          auVar266._44_4_ = (uint)bVar14 * auVar267._44_4_ | (uint)!bVar14 * auVar268._44_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xc) & 1);
          auVar266._48_4_ = (uint)bVar14 * auVar267._48_4_ | (uint)!bVar14 * auVar268._48_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xd) & 1);
          auVar266._52_4_ = (uint)bVar14 * auVar267._52_4_ | (uint)!bVar14 * auVar268._52_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xe) & 1);
          auVar266._56_4_ = (uint)bVar14 * auVar267._56_4_ | (uint)!bVar14 * auVar268._56_4_;
          bVar14 = SUB81(uVar16 >> 0xf,0);
          auVar266._60_4_ = (uint)bVar14 * auVar267._60_4_ | (uint)!bVar14 * auVar268._60_4_;
          auVar265 = vfmadd231ps_avx512f(auVar265,auVar266,auVar187);
          auVar265 = vfmadd231ps_avx512f(auVar265,auVar266,auVar188);
          auVar267 = vmulps_avx512f(auVar265,auVar265);
          auVar268 = vfmadd213ps_avx512f(auVar265,(undefined1  [64])afVar89,
                                         (undefined1  [64])afVar90);
          auVar268 = vfmadd213ps_avx512f(auVar268,auVar265,(undefined1  [64])afVar91);
          auVar268 = vfmadd213ps_avx512f(auVar268,auVar265,(undefined1  [64])afVar92);
          auVar268 = vfmadd213ps_avx512f(auVar268,auVar265,(undefined1  [64])afVar93);
          auVar268 = vfmadd213ps_avx512f(auVar268,auVar265,(undefined1  [64])afVar94);
          auVar265 = vfmadd213ps_avx512f(auVar268,auVar267,auVar265);
          auVar265 = vaddps_avx512f(auVar265,(undefined1  [64])afVar85);
          auVar267 = vcvttps2dq_avx512f(auVar266);
          auVar267 = vpaddd_avx512f(auVar267,auVar189);
          auVar267 = vpslld_avx512f(auVar267,0x17);
          auVar265 = vfmadd213ps_avx512f(auVar267,auVar265,auVar191);
          auVar267 = vmaxps_avx512f(auVar265,(undefined1  [64])_ps512_min_norm_pos);
          auVar268 = vpsrld_avx512f(auVar267,0x17);
          auVar267 = vpternlogd_avx512f(auVar267,(undefined1  [64])afVar94,
                                        (undefined1  [64])_ps512_inv_mant_mask,0xec);
          uVar16 = vcmpps_avx512f(auVar267,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          auVar266 = vsubps_avx512f(auVar267,(undefined1  [64])afVar85);
          auVar193 = vaddps_avx512f(auVar266,auVar267);
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar267._0_4_ = (uint)bVar14 * auVar193._0_4_ | (uint)!bVar14 * auVar266._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar267._4_4_ = (uint)bVar14 * auVar193._4_4_ | (uint)!bVar14 * auVar266._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar267._8_4_ = (uint)bVar14 * auVar193._8_4_ | (uint)!bVar14 * auVar266._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar267._12_4_ = (uint)bVar14 * auVar193._12_4_ | (uint)!bVar14 * auVar266._12_4_;
          bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
          auVar267._16_4_ = (uint)bVar14 * auVar193._16_4_ | (uint)!bVar14 * auVar266._16_4_;
          bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
          auVar267._20_4_ = (uint)bVar14 * auVar193._20_4_ | (uint)!bVar14 * auVar266._20_4_;
          bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
          auVar267._24_4_ = (uint)bVar14 * auVar193._24_4_ | (uint)!bVar14 * auVar266._24_4_;
          bVar14 = (bool)((byte)(uVar16 >> 7) & 1);
          auVar267._28_4_ = (uint)bVar14 * auVar193._28_4_ | (uint)!bVar14 * auVar266._28_4_;
          bVar15 = (byte)(uVar16 >> 8);
          bVar14 = (bool)(bVar15 & 1);
          auVar267._32_4_ = (uint)bVar14 * auVar193._32_4_ | (uint)!bVar14 * auVar266._32_4_;
          bVar14 = (bool)((byte)(uVar16 >> 9) & 1);
          auVar267._36_4_ = (uint)bVar14 * auVar193._36_4_ | (uint)!bVar14 * auVar266._36_4_;
          bVar14 = (bool)((byte)(uVar16 >> 10) & 1);
          auVar267._40_4_ = (uint)bVar14 * auVar193._40_4_ | (uint)!bVar14 * auVar266._40_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xb) & 1);
          auVar267._44_4_ = (uint)bVar14 * auVar193._44_4_ | (uint)!bVar14 * auVar266._44_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xc) & 1);
          auVar267._48_4_ = (uint)bVar14 * auVar193._48_4_ | (uint)!bVar14 * auVar266._48_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xd) & 1);
          auVar267._52_4_ = (uint)bVar14 * auVar193._52_4_ | (uint)!bVar14 * auVar266._52_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xe) & 1);
          auVar267._56_4_ = (uint)bVar14 * auVar193._56_4_ | (uint)!bVar14 * auVar266._56_4_;
          bVar14 = SUB81(uVar16 >> 0xf,0);
          auVar267._60_4_ = (uint)bVar14 * auVar193._60_4_ | (uint)!bVar14 * auVar266._60_4_;
          auVar266 = vmulps_avx512f(auVar267,auVar267);
          auVar193 = vfmadd132ps_avx512f(auVar267,(undefined1  [64])_ps512_cephes_log_p1,
                                         (undefined1  [64])_ps512_cephes_log_p0);
          auVar193 = vfmadd213ps_avx512f(auVar193,auVar267,(undefined1  [64])_ps512_cephes_log_p2);
          auVar193 = vfmadd213ps_avx512f(auVar193,auVar267,(undefined1  [64])_ps512_cephes_log_p3);
          auVar193 = vfmadd213ps_avx512f(auVar193,auVar267,(undefined1  [64])_ps512_cephes_log_p4);
          auVar193 = vfmadd213ps_avx512f(auVar193,auVar267,(undefined1  [64])_ps512_cephes_log_p5);
          auVar193 = vfmadd213ps_avx512f(auVar193,auVar267,(undefined1  [64])_ps512_cephes_log_p6);
          auVar193 = vfmadd213ps_avx512f(auVar193,auVar267,(undefined1  [64])_ps512_cephes_log_p7);
          in_ZMM21 = vfmadd213ps_avx512f(auVar193,auVar267,(undefined1  [64])_ps512_cephes_log_p8);
          auVar193 = vmulps_avx512f(auVar266,auVar267);
          auVar267 = vfmadd213ps_avx512f(auVar193,in_ZMM21,auVar267);
          uVar17 = vcmpps_avx512f(auVar265,auVar269,2);
          auVar265 = vpsubd_avx512f(auVar268,auVar189);
          auVar265 = vcvtdq2ps_avx512f(auVar265);
          auVar268 = vaddps_avx512f(auVar265,(undefined1  [64])afVar85);
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar193._0_4_ = (uint)bVar14 * auVar265._0_4_ | (uint)!bVar14 * auVar268._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar193._4_4_ = (uint)bVar14 * auVar265._4_4_ | (uint)!bVar14 * auVar268._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar193._8_4_ = (uint)bVar14 * auVar265._8_4_ | (uint)!bVar14 * auVar268._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar193._12_4_ = (uint)bVar14 * auVar265._12_4_ | (uint)!bVar14 * auVar268._12_4_;
          bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
          auVar193._16_4_ = (uint)bVar14 * auVar265._16_4_ | (uint)!bVar14 * auVar268._16_4_;
          bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
          auVar193._20_4_ = (uint)bVar14 * auVar265._20_4_ | (uint)!bVar14 * auVar268._20_4_;
          bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
          auVar193._24_4_ = (uint)bVar14 * auVar265._24_4_ | (uint)!bVar14 * auVar268._24_4_;
          bVar14 = (bool)((byte)(uVar16 >> 7) & 1);
          auVar193._28_4_ = (uint)bVar14 * auVar265._28_4_ | (uint)!bVar14 * auVar268._28_4_;
          bVar14 = (bool)(bVar15 & 1);
          auVar193._32_4_ = (uint)bVar14 * auVar265._32_4_ | (uint)!bVar14 * auVar268._32_4_;
          bVar14 = (bool)((byte)(uVar16 >> 9) & 1);
          auVar193._36_4_ = (uint)bVar14 * auVar265._36_4_ | (uint)!bVar14 * auVar268._36_4_;
          bVar14 = (bool)((byte)(uVar16 >> 10) & 1);
          auVar193._40_4_ = (uint)bVar14 * auVar265._40_4_ | (uint)!bVar14 * auVar268._40_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xb) & 1);
          auVar193._44_4_ = (uint)bVar14 * auVar265._44_4_ | (uint)!bVar14 * auVar268._44_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xc) & 1);
          auVar193._48_4_ = (uint)bVar14 * auVar265._48_4_ | (uint)!bVar14 * auVar268._48_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xd) & 1);
          auVar193._52_4_ = (uint)bVar14 * auVar265._52_4_ | (uint)!bVar14 * auVar268._52_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xe) & 1);
          auVar193._56_4_ = (uint)bVar14 * auVar265._56_4_ | (uint)!bVar14 * auVar268._56_4_;
          bVar14 = SUB81(uVar16 >> 0xf,0);
          auVar193._60_4_ = (uint)bVar14 * auVar265._60_4_ | (uint)!bVar14 * auVar268._60_4_;
          auVar265 = vfmadd231ps_avx512f(auVar267,auVar193,(undefined1  [64])afVar95);
          auVar265 = vfmadd231ps_avx512f(auVar265,auVar190,auVar266);
          in_ZMM22 = vfmadd231ps_avx512f(auVar265,(undefined1  [64])afVar96,auVar193);
          auVar265 = vmulps_avx512f(in_ZMM22,auVar192);
          auVar267 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
          bVar14 = (bool)((byte)uVar17 & 1);
          auVar268._0_4_ = (uint)bVar14 * auVar267._0_4_ | (uint)!bVar14 * auVar265._0_4_;
          bVar14 = (bool)((byte)(uVar17 >> 1) & 1);
          auVar268._4_4_ = (uint)bVar14 * auVar267._4_4_ | (uint)!bVar14 * auVar265._4_4_;
          bVar14 = (bool)((byte)(uVar17 >> 2) & 1);
          auVar268._8_4_ = (uint)bVar14 * auVar267._8_4_ | (uint)!bVar14 * auVar265._8_4_;
          bVar14 = (bool)((byte)(uVar17 >> 3) & 1);
          auVar268._12_4_ = (uint)bVar14 * auVar267._12_4_ | (uint)!bVar14 * auVar265._12_4_;
          bVar14 = (bool)((byte)(uVar17 >> 4) & 1);
          auVar268._16_4_ = (uint)bVar14 * auVar267._16_4_ | (uint)!bVar14 * auVar265._16_4_;
          bVar14 = (bool)((byte)(uVar17 >> 5) & 1);
          auVar268._20_4_ = (uint)bVar14 * auVar267._20_4_ | (uint)!bVar14 * auVar265._20_4_;
          bVar14 = (bool)((byte)(uVar17 >> 6) & 1);
          auVar268._24_4_ = (uint)bVar14 * auVar267._24_4_ | (uint)!bVar14 * auVar265._24_4_;
          bVar14 = (bool)((byte)(uVar17 >> 7) & 1);
          auVar268._28_4_ = (uint)bVar14 * auVar267._28_4_ | (uint)!bVar14 * auVar265._28_4_;
          bVar14 = (bool)((byte)(uVar17 >> 8) & 1);
          auVar268._32_4_ = (uint)bVar14 * auVar267._32_4_ | (uint)!bVar14 * auVar265._32_4_;
          bVar14 = (bool)((byte)(uVar17 >> 9) & 1);
          auVar268._36_4_ = (uint)bVar14 * auVar267._36_4_ | (uint)!bVar14 * auVar265._36_4_;
          bVar14 = (bool)((byte)(uVar17 >> 10) & 1);
          auVar268._40_4_ = (uint)bVar14 * auVar267._40_4_ | (uint)!bVar14 * auVar265._40_4_;
          bVar14 = (bool)((byte)(uVar17 >> 0xb) & 1);
          auVar268._44_4_ = (uint)bVar14 * auVar267._44_4_ | (uint)!bVar14 * auVar265._44_4_;
          bVar14 = (bool)((byte)(uVar17 >> 0xc) & 1);
          auVar268._48_4_ = (uint)bVar14 * auVar267._48_4_ | (uint)!bVar14 * auVar265._48_4_;
          bVar14 = (bool)((byte)(uVar17 >> 0xd) & 1);
          auVar268._52_4_ = (uint)bVar14 * auVar267._52_4_ | (uint)!bVar14 * auVar265._52_4_;
          bVar14 = (bool)((byte)(uVar17 >> 0xe) & 1);
          auVar268._56_4_ = (uint)bVar14 * auVar267._56_4_ | (uint)!bVar14 * auVar265._56_4_;
          bVar14 = SUB81(uVar17 >> 0xf,0);
          auVar268._60_4_ = (uint)bVar14 * auVar267._60_4_ | (uint)!bVar14 * auVar265._60_4_;
          auVar265 = vminps_avx512f(auVar268,(undefined1  [64])afVar86);
          auVar265 = vmaxps_avx512f(auVar265,(undefined1  [64])afVar87);
          auVar267 = vfmadd213ps_avx512f((undefined1  [64])afVar88,auVar265,
                                         (undefined1  [64])afVar94);
          auVar268 = vrndscaleps_avx512f(auVar267,1);
          uVar16 = vcmpps_avx512f(auVar267,auVar268,1);
          auVar267 = vsubps_avx512f(auVar268,(undefined1  [64])afVar85);
          bVar14 = (bool)((byte)uVar16 & 1);
          in_ZMM19._0_4_ = (uint)bVar14 * auVar267._0_4_ | (uint)!bVar14 * auVar268._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          in_ZMM19._4_4_ = (uint)bVar14 * auVar267._4_4_ | (uint)!bVar14 * auVar268._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          in_ZMM19._8_4_ = (uint)bVar14 * auVar267._8_4_ | (uint)!bVar14 * auVar268._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          in_ZMM19._12_4_ = (uint)bVar14 * auVar267._12_4_ | (uint)!bVar14 * auVar268._12_4_;
          bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
          in_ZMM19._16_4_ = (uint)bVar14 * auVar267._16_4_ | (uint)!bVar14 * auVar268._16_4_;
          bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
          in_ZMM19._20_4_ = (uint)bVar14 * auVar267._20_4_ | (uint)!bVar14 * auVar268._20_4_;
          bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
          in_ZMM19._24_4_ = (uint)bVar14 * auVar267._24_4_ | (uint)!bVar14 * auVar268._24_4_;
          bVar14 = (bool)((byte)(uVar16 >> 7) & 1);
          in_ZMM19._28_4_ = (uint)bVar14 * auVar267._28_4_ | (uint)!bVar14 * auVar268._28_4_;
          bVar14 = (bool)((byte)(uVar16 >> 8) & 1);
          in_ZMM19._32_4_ = (uint)bVar14 * auVar267._32_4_ | (uint)!bVar14 * auVar268._32_4_;
          bVar14 = (bool)((byte)(uVar16 >> 9) & 1);
          in_ZMM19._36_4_ = (uint)bVar14 * auVar267._36_4_ | (uint)!bVar14 * auVar268._36_4_;
          bVar14 = (bool)((byte)(uVar16 >> 10) & 1);
          in_ZMM19._40_4_ = (uint)bVar14 * auVar267._40_4_ | (uint)!bVar14 * auVar268._40_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xb) & 1);
          in_ZMM19._44_4_ = (uint)bVar14 * auVar267._44_4_ | (uint)!bVar14 * auVar268._44_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xc) & 1);
          in_ZMM19._48_4_ = (uint)bVar14 * auVar267._48_4_ | (uint)!bVar14 * auVar268._48_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xd) & 1);
          in_ZMM19._52_4_ = (uint)bVar14 * auVar267._52_4_ | (uint)!bVar14 * auVar268._52_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xe) & 1);
          in_ZMM19._56_4_ = (uint)bVar14 * auVar267._56_4_ | (uint)!bVar14 * auVar268._56_4_;
          bVar14 = SUB81(uVar16 >> 0xf,0);
          in_ZMM19._60_4_ = (uint)bVar14 * auVar267._60_4_ | (uint)!bVar14 * auVar268._60_4_;
          auVar265 = vfmadd231ps_avx512f(auVar265,in_ZMM19,auVar187);
          auVar265 = vfmadd231ps_avx512f(auVar265,in_ZMM19,auVar188);
          auVar267 = vmulps_avx512f(auVar265,auVar265);
          auVar268 = vfmadd213ps_avx512f(auVar265,(undefined1  [64])afVar89,
                                         (undefined1  [64])afVar90);
          auVar268 = vfmadd213ps_avx512f(auVar268,auVar265,(undefined1  [64])afVar91);
          auVar268 = vfmadd213ps_avx512f(auVar268,auVar265,(undefined1  [64])afVar92);
          auVar268 = vfmadd213ps_avx512f(auVar268,auVar265,(undefined1  [64])afVar93);
          auVar268 = vfmadd213ps_avx512f(auVar268,auVar265,(undefined1  [64])afVar94);
          in_ZMM20 = vfmadd213ps_avx512f(auVar268,auVar267,auVar265);
          auVar265 = vaddps_avx512f(in_ZMM20,(undefined1  [64])afVar85);
          auVar267 = vcvttps2dq_avx512f(in_ZMM19);
          auVar267 = vpaddd_avx512f(auVar267,auVar189);
          auVar267 = vpslld_avx512f(auVar267,0x17);
          in_ZMM18 = vfmadd213ps_avx512f(auVar267,auVar265,auVar191);
          auVar265 = vdivps_avx512f(auVar191,in_ZMM18);
          in_ZMM17 = vfnmsub213ps_avx512f(auVar265,auVar192,auVar191);
          goto LAB_002ce35b;
        case 6:
          puVar11 = (uint *)(this->super_InnerProduct).activation_params.data;
          auVar267 = vbroadcastss_avx512f(ZEXT416(*puVar11));
          uVar110 = puVar11[1];
          auVar265._4_4_ = uVar110;
          auVar265._0_4_ = uVar110;
          auVar265._8_4_ = uVar110;
          auVar265._12_4_ = uVar110;
          auVar265._16_4_ = uVar110;
          auVar265._20_4_ = uVar110;
          auVar265._24_4_ = uVar110;
          auVar265._28_4_ = uVar110;
          auVar265._32_4_ = uVar110;
          auVar265._36_4_ = uVar110;
          auVar265._40_4_ = uVar110;
          auVar265._44_4_ = uVar110;
          auVar265._48_4_ = uVar110;
          auVar265._52_4_ = uVar110;
          auVar265._56_4_ = uVar110;
          auVar265._60_4_ = uVar110;
          auVar265 = vfmadd213ps_avx512f(auVar267,auVar264,auVar265);
          auVar265 = vmaxps_avx512f(auVar265,auVar269);
          in_ZMM17 = vminps_avx512f(auVar265,auVar191);
LAB_002ce35b:
          in_ZMM16 = vmulps_avx512f(in_ZMM17,auVar264);
        }
        *(undefined1 (*) [64])((long)top_blob->data + uVar101 * 0x40) = in_ZMM16;
        uVar101 = uVar101 + 1;
      } while (uVar101 != uVar99);
    }
  }
  iVar97 = 0;
LAB_002cff3d:
  piVar8 = (int *)CONCAT44(uStack_11c,uStack_120);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_108 == (Allocator *)0x0) {
        if (local_128 != (undefined1 (*) [32])0x0) {
          free(local_128);
        }
      }
      else {
        (*local_108->_vptr_Allocator[3])();
      }
    }
  }
  return iVar97;
}

Assistant:

int InnerProduct_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
        if (bottom_blob_flattened.empty())
            return -100;
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}